

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *puVar1;
  undefined1 (*pauVar2) [12];
  long *plVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  float *pfVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  int iVar52;
  int iVar53;
  size_t sVar54;
  size_t sVar55;
  int *piVar56;
  void *pvVar57;
  _func_int **pp_Var58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined8 uVar260;
  undefined8 uVar261;
  undefined8 uVar262;
  undefined8 uVar263;
  undefined8 uVar264;
  undefined8 uVar265;
  undefined8 uVar266;
  undefined8 uVar267;
  undefined8 uVar268;
  undefined8 uVar269;
  undefined8 uVar270;
  undefined8 uVar271;
  undefined1 auVar272 [12];
  undefined1 auVar273 [12];
  undefined8 uVar274;
  undefined8 uVar275;
  Allocator *pAVar276;
  int iVar277;
  int iVar278;
  int iVar279;
  byte bVar280;
  int iVar281;
  int iVar282;
  uint uVar283;
  void *pvVar284;
  ulong uVar285;
  int iVar286;
  ulong uVar287;
  float *pfVar288;
  ulong uVar289;
  _func_int *p_Var290;
  long lVar291;
  void *pvVar292;
  float *pfVar293;
  void *pvVar294;
  int _w;
  uint uVar295;
  int iVar296;
  long lVar297;
  ulong uVar298;
  long lVar299;
  long lVar300;
  Layer *pLVar301;
  int i;
  int _h;
  int iVar302;
  int j_1;
  uint uVar303;
  undefined1 (*pauVar304) [16];
  void *pvVar305;
  int iVar306;
  long lVar307;
  void *pvVar308;
  pointer piVar309;
  float *pfVar310;
  pointer piVar311;
  int j;
  int iVar312;
  long lVar313;
  ulong uVar314;
  float *pfVar315;
  float *pfVar316;
  float *pfVar317;
  pointer piVar318;
  pointer piVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar330;
  float fVar335;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined4 uVar336;
  undefined4 uVar337;
  undefined4 uVar338;
  undefined4 uVar339;
  float fVar340;
  float fVar341;
  float fVar352;
  float fVar355;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar342;
  float fVar353;
  float fVar356;
  undefined1 auVar348 [16];
  float fVar343;
  float fVar354;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  v4sf one;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  undefined1 auVar365 [16];
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  Mat local_248;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  Option opt_p;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat m_1;
  Mat m;
  Option opt_g;
  
  p_Var290 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if ((opt->use_int8_inference == true) && (*(int *)(&this->field_0x10c + (long)p_Var290) != 0)) {
    iVar281 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar281;
  }
  uVar295 = bottom_blob->c;
  uVar298 = (ulong)uVar295;
  uVar314 = bottom_blob->elemsize;
  iVar281 = bottom_blob->elempack;
  iVar306 = *(int *)(&this->field_0xd4 + (long)p_Var290);
  iVar312 = *(int *)(&this->field_0xdc + (long)p_Var290);
  iVar286 = *(int *)(&this->field_0xd8 + (long)p_Var290);
  iVar52 = *(int *)(&this->field_0xe0 + (long)p_Var290);
  local_248.cstep = 0;
  local_248.data = (pointer)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize._0_4_ = 0;
  local_248.elemsize._4_4_ = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86 +
             (long)this->_vptr_ConvolutionDepthWise_x86[-3]),bottom_blob,&local_248,opt);
  iVar277 = local_248.w;
  iVar296 = -100;
  if (((pointer)local_248.data == (pointer)0x0) || ((long)local_248.c * local_248.cstep == 0))
  goto LAB_003d27ff;
  p_Var290 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar306 = (~((iVar306 + -1) * iVar312) + local_248.w) /
            *(int *)(&this->field_0xe4 + (long)p_Var290);
  iVar312 = (~((iVar286 + -1) * iVar52) + local_248.h) /
            *(int *)(&this->field_0xe8 + (long)p_Var290);
  _w = iVar306 + 1;
  _h = iVar312 + 1;
  bVar280 = (*(uint *)(&this->field_0xd0 + (long)p_Var290) & 3) == 0 & opt->use_packing_layout;
  uVar303 = (uint)bVar280 + (uint)bVar280 * 2 + 1;
  uVar314 = uVar314 / (ulong)(long)iVar281 << bVar280 * '\x02';
  Mat::create(top_blob,_w,_h,(int)*(uint *)(&this->field_0xd0 + (long)p_Var290) / (int)uVar303,
              uVar314,uVar303,opt->blob_allocator);
  sVar55 = local_248.cstep;
  iVar279 = local_248.d;
  iVar278 = local_248.h;
  iVar302 = local_248.w;
  iVar52 = local_248.dims;
  pAVar276 = local_248.allocator;
  iVar286 = local_248.elempack;
  pvVar292 = top_blob->data;
  if ((pvVar292 == (void *)0x0) || (sVar54 = top_blob->cstep, (long)top_blob->c * sVar54 == 0))
  goto LAB_003d27ff;
  iVar282 = iVar281 * uVar295;
  p_Var290 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar296 = *(int *)(&this->field_0xd0 + (long)p_Var290);
  iVar53 = *(int *)(&this->field_0x108 + (long)p_Var290);
  if ((iVar282 == iVar53) && (iVar282 == iVar296)) {
    iVar296 = iVar282;
    if (iVar281 == 1) {
      if ((*(int *)(&this->field_0xd4 + (long)p_Var290) == 3) &&
         (*(int *)(&this->field_0xd8 + (long)p_Var290) == 3)) {
        if ((*(int *)(&this->field_0xdc + (long)p_Var290) == 1) &&
           (((*(int *)(&this->field_0xe0 + (long)p_Var290) == 1 &&
             (*(int *)(&this->field_0xe4 + (long)p_Var290) == 1)) &&
            (*(int *)(&this->field_0xe8 + (long)p_Var290) == 1)))) {
          lVar299 = (long)local_248.w;
          iVar281 = top_blob->w;
          iVar306 = top_blob->h;
          pvVar57 = (this->weight_data_tm).data;
          sVar55 = top_blob->elemsize;
          lVar300 = *(long *)(&this->field_0x1b0 + (long)p_Var290);
          lVar291 = (long)iVar281;
          local_1e8 = SUB84(local_248.data,0);
          fStack_1e4 = (float)((ulong)local_248.data >> 0x20);
          local_1f8 = CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) *
                      local_248.cstep;
          local_1d8 = lVar299 * 2;
          uVar314 = 0;
          uVar295 = local_248.c;
          if (local_248.c < 1) {
            uVar295 = 0;
          }
          lVar297 = (long)(local_248.w + 2) * 4;
          for (; uVar314 != uVar295; uVar314 = uVar314 + 1) {
            if (lVar300 == 0) {
              fVar320 = 0.0;
            }
            else {
              fVar320 = *(float *)(lVar300 + uVar314 * 4);
            }
            pvVar294 = (void *)(sVar54 * sVar55 * uVar314 + (long)pvVar292);
            lVar307 = uVar314 * 0x24;
            piVar318 = (pointer)(local_1f8 * uVar314 + (long)local_248.data);
            piVar311 = piVar318 + local_248.w;
            piVar309 = piVar318 + lVar299 * 2;
            piVar319 = piVar318 + lVar299 * 3;
            pvVar284 = pvVar294;
            for (uVar303 = 0; (int)(uVar303 | 1) < iVar306; uVar303 = uVar303 + 2) {
              lVar313 = 0;
              for (iVar312 = iVar281; 0 < iVar312; iVar312 = iVar312 + -1) {
                uVar50 = *(undefined8 *)((long)piVar318 + lVar313 + 4);
                uVar51 = *(undefined8 *)((long)piVar311 + lVar313 + 4);
                fVar356 = (float)uVar51;
                fVar340 = (float)((ulong)uVar51 >> 0x20);
                fVar353 = (float)*(undefined8 *)((long)piVar309 + lVar313);
                fVar355 = (float)((ulong)*(undefined8 *)((long)piVar309 + lVar313) >> 0x20);
                pfVar316 = (float *)((long)pvVar57 + lVar307);
                fVar343 = *pfVar316;
                fVar335 = pfVar316[1];
                fVar354 = pfVar316[2];
                fVar361 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar57 + lVar307 + 0x10);
                fVar362 = *pfVar316;
                fVar363 = pfVar316[1];
                fVar364 = pfVar316[2];
                fVar342 = pfVar316[3];
                fVar321 = *(float *)((long)piVar311 + lVar313);
                fVar322 = *(float *)((long)piVar309 + lVar313 + 8);
                fVar323 = *(float *)((long)pvVar57 + lVar307 + 0x20);
                uVar51 = *(undefined8 *)((long)piVar319 + lVar313);
                fVar330 = *(float *)((long)piVar319 + lVar313 + 8);
                *(float *)((long)pvVar294 + lVar313) =
                     fVar323 * fVar322 + fVar320 +
                     fVar355 * fVar342 + fVar321 * fVar361 +
                     fVar340 * fVar363 + (float)uVar50 * fVar335 +
                     fVar353 * fVar364 + (float)((ulong)uVar50 >> 0x20) * fVar354 +
                     fVar356 * fVar362 + *(float *)((long)piVar318 + lVar313) * fVar343;
                *(float *)((long)pvVar284 + lVar313 + lVar291 * 4) =
                     fVar323 * fVar330 + fVar320 +
                     (float)((ulong)uVar51 >> 0x20) * fVar342 + fVar361 * fVar353 +
                     fVar322 * fVar363 + fVar335 * fVar356 +
                     (float)uVar51 * fVar364 + fVar354 * fVar340 +
                     fVar355 * fVar362 + fVar321 * fVar343;
                lVar313 = lVar313 + 4;
              }
              piVar318 = (pointer)((long)piVar318 + lVar313 + lVar297);
              piVar311 = (pointer)((long)piVar311 + lVar313 + lVar297);
              piVar309 = (pointer)((long)piVar309 + lVar313 + lVar297);
              piVar319 = (pointer)((long)piVar319 + lVar313 + lVar297);
              pvVar294 = (void *)((long)pvVar294 + lVar313 + lVar291 * 4);
              pvVar284 = (void *)((long)pvVar284 + lVar313 + lVar291 * 4);
            }
            for (; (int)uVar303 < iVar306; uVar303 = uVar303 + 1) {
              lVar313 = 0;
              for (iVar312 = iVar281; 0 < iVar312; iVar312 = iVar312 + -1) {
                uVar50 = *(undefined8 *)((long)piVar318 + lVar313 + 4);
                pfVar316 = (float *)((long)pvVar57 + lVar307);
                pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x10);
                uVar51 = *(undefined8 *)((long)piVar311 + lVar313 + 4);
                *(float *)((long)pvVar294 + lVar313) =
                     *(float *)((long)pvVar57 + lVar307 + 0x20) *
                     *(float *)((long)piVar309 + lVar313 + 8) + fVar320 +
                     (float)((ulong)*(undefined8 *)((long)piVar309 + lVar313) >> 0x20) * pfVar315[3]
                     + *(float *)((long)piVar311 + lVar313) * pfVar316[3] +
                     (float)((ulong)uVar51 >> 0x20) * pfVar315[1] + (float)uVar50 * pfVar316[1] +
                     (float)*(undefined8 *)((long)piVar309 + lVar313) * pfVar315[2] +
                     (float)((ulong)uVar50 >> 0x20) * pfVar316[2] +
                     (float)uVar51 * *pfVar315 + *(float *)((long)piVar318 + lVar313) * *pfVar316;
                lVar313 = lVar313 + 4;
              }
              piVar318 = (pointer)((long)piVar318 + lVar313 + 8);
              piVar311 = (pointer)((long)piVar311 + lVar313 + 8);
              piVar309 = (pointer)((long)piVar309 + lVar313 + 8);
              pvVar294 = (void *)((long)pvVar294 + lVar313);
            }
          }
          pLVar301 = this->activation;
LAB_003d285d:
          if (pLVar301 != (Layer *)0x0) {
            (*pLVar301->_vptr_Layer[9])(pLVar301,top_blob,opt);
          }
          goto LAB_003d272a;
        }
        if (((*(int *)(&this->field_0xdc + (long)p_Var290) == 1) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var290) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var290) == 2 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var290) == 2)))) {
          iVar281 = top_blob->w;
          pvVar57 = (this->weight_data_tm).data;
          lVar300 = *(long *)(&this->field_0x1b0 + (long)p_Var290);
          sVar55 = top_blob->elemsize;
          uVar314 = 0;
          iVar306 = top_blob->h;
          if (top_blob->h < 1) {
            iVar306 = 0;
          }
          uVar298 = (ulong)(uint)local_248.c;
          if (local_248.c < 1) {
            uVar298 = uVar314;
          }
          lVar299 = (long)((local_248.w - iVar281) * 2) * 4;
          for (; uVar314 != uVar298; uVar314 = uVar314 + 1) {
            if (lVar300 == 0) {
              fVar320 = 0.0;
            }
            else {
              fVar320 = *(float *)(lVar300 + uVar314 * 4);
            }
            pfVar316 = (float *)(sVar54 * sVar55 * uVar314 + (long)pvVar292);
            lVar291 = uVar314 * 0x24;
            piVar319 = (pointer)(CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) *
                                 local_248.cstep * uVar314 + (long)local_248.data);
            piVar311 = piVar319 + local_248.w;
            piVar309 = piVar319 + (long)local_248.w * 2;
            for (iVar312 = 0; iVar312 != iVar306; iVar312 = iVar312 + 1) {
              lVar297 = 0;
              for (iVar286 = iVar281; 0 < iVar286; iVar286 = iVar286 + -1) {
                uVar50 = *(undefined8 *)((long)piVar319 + lVar297 + 4);
                pfVar315 = (float *)((long)pvVar57 + lVar291);
                pfVar293 = (float *)((long)pvVar57 + lVar291 + 0x10);
                uVar51 = *(undefined8 *)((long)piVar311 + lVar297 + 4);
                *pfVar316 = (float)((ulong)*(undefined8 *)((long)piVar309 + lVar297) >> 0x20) *
                            pfVar293[3] + *(float *)((long)piVar311 + lVar297) * pfVar315[3] +
                            (float)((ulong)uVar51 >> 0x20) * pfVar293[1] +
                            (float)uVar50 * pfVar315[1] +
                            (float)*(undefined8 *)((long)piVar309 + lVar297) * pfVar293[2] +
                            (float)((ulong)uVar50 >> 0x20) * pfVar315[2] +
                            (float)uVar51 * *pfVar293 +
                            *(float *)((long)piVar319 + lVar297) * *pfVar315 +
                            *(float *)((long)pvVar57 + lVar291 + 0x20) *
                            *(float *)((long)piVar309 + lVar297 + 8) + fVar320;
                pfVar316 = pfVar316 + 1;
                lVar297 = lVar297 + 8;
              }
              piVar319 = (pointer)((long)piVar319 + lVar297 + lVar299);
              piVar311 = (pointer)((long)piVar311 + lVar297 + lVar299);
              piVar309 = (pointer)((long)piVar309 + lVar297 + lVar299);
            }
          }
          goto LAB_003d284b;
        }
      }
    }
    else if (iVar281 == 4) {
      iVar281 = *(int *)(&this->field_0xd4 + (long)p_Var290);
      iVar286 = *(int *)(&this->field_0xd8 + (long)p_Var290);
      if (iVar281 == 5) {
        if (iVar286 == 5) {
          if (((*(int *)(&this->field_0xdc + (long)p_Var290) == 1) &&
              (*(int *)(&this->field_0xe0 + (long)p_Var290) == 1)) &&
             ((*(int *)(&this->field_0xe4 + (long)p_Var290) == 1 &&
              (*(int *)(&this->field_0xe8 + (long)p_Var290) == 1)))) {
            uVar295 = top_blob->w;
            iVar281 = top_blob->h;
            lVar300 = *(long *)(&this->field_0x1b0 + (long)p_Var290);
            uVar298 = 0;
            uVar314 = (ulong)uVar295;
            if ((int)uVar295 < 1) {
              uVar314 = uVar298;
            }
            uVar303 = local_248.c;
            if (local_248.c < 1) {
              uVar303 = 0;
            }
            lVar291 = (long)(local_248.w * 4 + 0x10) * 4;
            lVar299 = (long)(int)(uVar295 * 4) * 4;
            for (; uVar298 != uVar303; uVar298 = uVar298 + 1) {
              if (lVar300 == 0) {
                fVar320 = 0.0;
                fVar321 = 0.0;
                fVar322 = 0.0;
                fVar323 = 0.0;
              }
              else {
                pfVar316 = (float *)(lVar300 + uVar298 * 0x10);
                fVar320 = *pfVar316;
                fVar321 = pfVar316[1];
                fVar322 = pfVar316[2];
                fVar323 = pfVar316[3];
              }
              pvVar308 = (void *)(top_blob->cstep * uVar298 * top_blob->elemsize +
                                 (long)top_blob->data);
              pvVar57 = (this->weight_data_tm).data;
              lVar307 = (long)(this->weight_data_tm).w * uVar298 * (this->weight_data_tm).elemsize;
              pvVar305 = (void *)((long)top_blob->w * top_blob->elemsize + (long)pvVar308);
              piVar319 = (pointer)(local_248.cstep * uVar298 *
                                   CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize)
                                  + (long)local_248.data);
              lVar297 = (long)local_248.w *
                        CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
              piVar311 = (pointer)((long)piVar319 + lVar297);
              pvVar292 = (void *)((long)piVar319 + lVar297 * 2);
              pvVar294 = (void *)(lVar297 * 3 + (long)piVar319);
              piVar309 = piVar319 + lVar297;
              pvVar284 = (void *)(lVar297 * 5 + (long)piVar319);
              for (uVar295 = 0; (int)(uVar295 | 1) < iVar281; uVar295 = uVar295 + 2) {
                lVar297 = 0;
                uVar287 = uVar314;
                while (iVar306 = (int)uVar287, uVar287 = (ulong)(iVar306 - 1), iVar306 != 0) {
                  pfVar316 = (float *)((long)pvVar57 + lVar307);
                  fVar330 = *pfVar316;
                  fVar343 = pfVar316[1];
                  fVar335 = pfVar316[2];
                  fVar354 = pfVar316[3];
                  pfVar316 = (float *)((long)pvVar57 + lVar307 + 0x10);
                  fVar361 = *pfVar316;
                  fVar362 = pfVar316[1];
                  fVar363 = pfVar316[2];
                  fVar364 = pfVar316[3];
                  pfVar316 = (float *)((long)pvVar57 + lVar307 + 0x20);
                  fVar342 = *pfVar316;
                  fVar353 = pfVar316[1];
                  fVar355 = pfVar316[2];
                  fVar356 = pfVar316[3];
                  pfVar316 = (float *)((long)pvVar57 + lVar307 + 0x30);
                  fVar340 = *pfVar316;
                  fVar64 = pfVar316[1];
                  fVar65 = pfVar316[2];
                  fVar66 = pfVar316[3];
                  pfVar316 = (float *)((long)pvVar57 + lVar307 + 0x40);
                  fVar67 = *pfVar316;
                  fVar68 = pfVar316[1];
                  fVar69 = pfVar316[2];
                  fVar70 = pfVar316[3];
                  pfVar316 = (float *)((long)piVar319 + lVar297);
                  fVar71 = pfVar316[1];
                  fVar72 = pfVar316[2];
                  fVar73 = pfVar316[3];
                  pfVar293 = (float *)((long)piVar319 + lVar297 + 0x10);
                  fVar74 = pfVar293[1];
                  fVar75 = pfVar293[2];
                  fVar76 = pfVar293[3];
                  pfVar317 = (float *)((long)piVar319 + lVar297 + 0x20);
                  fVar77 = pfVar317[1];
                  fVar78 = pfVar317[2];
                  fVar79 = pfVar317[3];
                  pfVar288 = (float *)((long)piVar319 + lVar297 + 0x30);
                  fVar80 = pfVar288[1];
                  fVar81 = pfVar288[2];
                  fVar82 = pfVar288[3];
                  pfVar310 = (float *)((long)piVar319 + lVar297 + 0x40);
                  fVar83 = pfVar310[1];
                  fVar84 = pfVar310[2];
                  fVar85 = pfVar310[3];
                  pfVar315 = (float *)((long)piVar311 + lVar297);
                  fVar86 = *pfVar315;
                  fVar87 = pfVar315[1];
                  fVar88 = pfVar315[2];
                  fVar89 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar311 + lVar297 + 0x10);
                  fVar90 = *pfVar315;
                  fVar91 = pfVar315[1];
                  fVar92 = pfVar315[2];
                  fVar93 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar311 + lVar297 + 0x20);
                  fVar94 = *pfVar315;
                  fVar95 = pfVar315[1];
                  fVar96 = pfVar315[2];
                  fVar97 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar311 + lVar297 + 0x30);
                  fVar98 = *pfVar315;
                  fVar357 = pfVar315[1];
                  fVar358 = pfVar315[2];
                  fVar359 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar311 + lVar297 + 0x40);
                  fVar360 = *pfVar315;
                  fVar341 = pfVar315[1];
                  fVar352 = pfVar315[2];
                  fVar99 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x50);
                  fVar100 = *pfVar315;
                  fVar101 = pfVar315[1];
                  fVar102 = pfVar315[2];
                  fVar103 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x60);
                  fVar104 = *pfVar315;
                  fVar105 = pfVar315[1];
                  fVar106 = pfVar315[2];
                  fVar107 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x70);
                  fVar108 = *pfVar315;
                  fVar109 = pfVar315[1];
                  fVar110 = pfVar315[2];
                  fVar111 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x80);
                  fVar112 = *pfVar315;
                  fVar113 = pfVar315[1];
                  fVar114 = pfVar315[2];
                  fVar115 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x90);
                  fVar116 = *pfVar315;
                  fVar117 = pfVar315[1];
                  fVar118 = pfVar315[2];
                  fVar119 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar292 + lVar297);
                  fVar120 = *pfVar315;
                  fVar121 = pfVar315[1];
                  fVar122 = pfVar315[2];
                  fVar123 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar292 + lVar297 + 0x10);
                  fVar124 = *pfVar315;
                  fVar125 = pfVar315[1];
                  fVar126 = pfVar315[2];
                  fVar127 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar292 + lVar297 + 0x20);
                  fVar128 = *pfVar315;
                  fVar129 = pfVar315[1];
                  fVar130 = pfVar315[2];
                  fVar131 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar292 + lVar297 + 0x30);
                  fVar132 = *pfVar315;
                  fVar133 = pfVar315[1];
                  fVar134 = pfVar315[2];
                  fVar135 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar292 + lVar297 + 0x40);
                  fVar136 = *pfVar315;
                  fVar137 = pfVar315[1];
                  fVar138 = pfVar315[2];
                  fVar139 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0xa0);
                  fVar140 = *pfVar315;
                  fVar141 = pfVar315[1];
                  fVar142 = pfVar315[2];
                  fVar143 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0xb0);
                  fVar144 = *pfVar315;
                  fVar145 = pfVar315[1];
                  fVar146 = pfVar315[2];
                  fVar147 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0xc0);
                  fVar148 = *pfVar315;
                  fVar149 = pfVar315[1];
                  fVar150 = pfVar315[2];
                  fVar151 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0xd0);
                  fVar152 = *pfVar315;
                  fVar153 = pfVar315[1];
                  fVar154 = pfVar315[2];
                  fVar155 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0xe0);
                  fVar156 = *pfVar315;
                  fVar157 = pfVar315[1];
                  fVar158 = pfVar315[2];
                  fVar159 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar294 + lVar297);
                  fVar160 = *pfVar315;
                  fVar161 = pfVar315[1];
                  fVar162 = pfVar315[2];
                  fVar163 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar294 + lVar297 + 0x10);
                  fVar164 = *pfVar315;
                  fVar165 = pfVar315[1];
                  fVar166 = pfVar315[2];
                  fVar167 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar294 + lVar297 + 0x20);
                  fVar168 = *pfVar315;
                  fVar169 = pfVar315[1];
                  fVar170 = pfVar315[2];
                  fVar171 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar294 + lVar297 + 0x30);
                  fVar172 = *pfVar315;
                  fVar173 = pfVar315[1];
                  fVar174 = pfVar315[2];
                  fVar175 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar294 + lVar297 + 0x40);
                  fVar176 = *pfVar315;
                  fVar177 = pfVar315[1];
                  fVar178 = pfVar315[2];
                  fVar179 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0xf0);
                  fVar180 = *pfVar315;
                  fVar181 = pfVar315[1];
                  fVar182 = pfVar315[2];
                  fVar183 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x100);
                  fVar184 = *pfVar315;
                  fVar185 = pfVar315[1];
                  fVar186 = pfVar315[2];
                  fVar187 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x110);
                  fVar188 = *pfVar315;
                  fVar189 = pfVar315[1];
                  fVar190 = pfVar315[2];
                  fVar191 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x120);
                  fVar192 = *pfVar315;
                  fVar193 = pfVar315[1];
                  fVar194 = pfVar315[2];
                  fVar195 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x130);
                  fVar196 = *pfVar315;
                  fVar197 = pfVar315[1];
                  fVar198 = pfVar315[2];
                  fVar199 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar309 + lVar297);
                  fVar200 = *pfVar315;
                  fVar201 = pfVar315[1];
                  fVar202 = pfVar315[2];
                  fVar203 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar309 + lVar297 + 0x10);
                  fVar204 = *pfVar315;
                  fVar205 = pfVar315[1];
                  fVar206 = pfVar315[2];
                  fVar207 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar309 + lVar297 + 0x20);
                  fVar208 = *pfVar315;
                  fVar209 = pfVar315[1];
                  fVar210 = pfVar315[2];
                  fVar211 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar309 + lVar297 + 0x30);
                  fVar212 = *pfVar315;
                  fVar213 = pfVar315[1];
                  fVar214 = pfVar315[2];
                  fVar215 = pfVar315[3];
                  pfVar315 = (float *)((long)piVar309 + lVar297 + 0x40);
                  fVar216 = *pfVar315;
                  fVar217 = pfVar315[1];
                  fVar218 = pfVar315[2];
                  fVar219 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x140);
                  fVar220 = *pfVar315;
                  fVar221 = pfVar315[1];
                  fVar222 = pfVar315[2];
                  fVar223 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x150);
                  fVar224 = *pfVar315;
                  fVar225 = pfVar315[1];
                  fVar226 = pfVar315[2];
                  fVar227 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x160);
                  fVar228 = *pfVar315;
                  fVar229 = pfVar315[1];
                  fVar230 = pfVar315[2];
                  fVar231 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x170);
                  fVar232 = *pfVar315;
                  fVar233 = pfVar315[1];
                  fVar234 = pfVar315[2];
                  fVar235 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar57 + lVar307 + 0x180);
                  fVar236 = *pfVar315;
                  fVar237 = pfVar315[1];
                  fVar238 = pfVar315[2];
                  fVar239 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar284 + lVar297);
                  fVar240 = *pfVar315;
                  fVar241 = pfVar315[1];
                  fVar242 = pfVar315[2];
                  fVar243 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar284 + lVar297 + 0x10);
                  fVar244 = *pfVar315;
                  fVar245 = pfVar315[1];
                  fVar246 = pfVar315[2];
                  fVar247 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar284 + lVar297 + 0x20);
                  fVar248 = *pfVar315;
                  fVar249 = pfVar315[1];
                  fVar250 = pfVar315[2];
                  fVar251 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar284 + lVar297 + 0x30);
                  fVar252 = *pfVar315;
                  fVar253 = pfVar315[1];
                  fVar254 = pfVar315[2];
                  fVar255 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar284 + lVar297 + 0x40);
                  fVar256 = *pfVar315;
                  fVar257 = pfVar315[1];
                  fVar258 = pfVar315[2];
                  fVar259 = pfVar315[3];
                  pfVar315 = (float *)((long)pvVar308 + lVar297);
                  *pfVar315 = fVar216 * fVar236 +
                              fVar212 * fVar232 + fVar208 * fVar228 + fVar204 * fVar224 +
                              fVar200 * fVar220 +
                              fVar176 * fVar196 +
                              fVar172 * fVar192 +
                              fVar168 * fVar188 + fVar164 * fVar184 + fVar160 * fVar180 +
                              fVar136 * fVar156 +
                              fVar132 * fVar152 +
                              fVar128 * fVar148 + fVar124 * fVar144 + fVar120 * fVar140 +
                              fVar360 * fVar116 +
                              fVar98 * fVar112 + fVar94 * fVar108 + fVar90 * fVar104 +
                              fVar86 * fVar100 + *pfVar310 * fVar67 + *pfVar288 * fVar340 +
                              *pfVar317 * fVar342 + *pfVar293 * fVar361 +
                              *pfVar316 * fVar330 + fVar320;
                  pfVar315[1] = fVar217 * fVar237 +
                                fVar213 * fVar233 + fVar209 * fVar229 + fVar205 * fVar225 +
                                fVar201 * fVar221 +
                                fVar177 * fVar197 +
                                fVar173 * fVar193 +
                                fVar169 * fVar189 + fVar165 * fVar185 + fVar161 * fVar181 +
                                fVar137 * fVar157 +
                                fVar133 * fVar153 +
                                fVar129 * fVar149 + fVar125 * fVar145 + fVar121 * fVar141 +
                                fVar341 * fVar117 +
                                fVar357 * fVar113 + fVar95 * fVar109 + fVar91 * fVar105 +
                                fVar87 * fVar101 + fVar83 * fVar68 + fVar80 * fVar64 +
                                fVar77 * fVar353 + fVar74 * fVar362 + fVar71 * fVar343 + fVar321;
                  pfVar315[2] = fVar218 * fVar238 +
                                fVar214 * fVar234 + fVar210 * fVar230 + fVar206 * fVar226 +
                                fVar202 * fVar222 +
                                fVar178 * fVar198 +
                                fVar174 * fVar194 +
                                fVar170 * fVar190 + fVar166 * fVar186 + fVar162 * fVar182 +
                                fVar138 * fVar158 +
                                fVar134 * fVar154 +
                                fVar130 * fVar150 + fVar126 * fVar146 + fVar122 * fVar142 +
                                fVar352 * fVar118 +
                                fVar358 * fVar114 + fVar96 * fVar110 + fVar92 * fVar106 +
                                fVar88 * fVar102 + fVar84 * fVar69 + fVar81 * fVar65 +
                                fVar78 * fVar355 + fVar75 * fVar363 + fVar72 * fVar335 + fVar322;
                  pfVar315[3] = fVar219 * fVar239 +
                                fVar215 * fVar235 + fVar211 * fVar231 + fVar207 * fVar227 +
                                fVar203 * fVar223 +
                                fVar179 * fVar199 +
                                fVar175 * fVar195 +
                                fVar171 * fVar191 + fVar167 * fVar187 + fVar163 * fVar183 +
                                fVar139 * fVar159 +
                                fVar135 * fVar155 +
                                fVar131 * fVar151 + fVar127 * fVar147 + fVar123 * fVar143 +
                                fVar99 * fVar119 +
                                fVar359 * fVar115 + fVar97 * fVar111 + fVar93 * fVar107 +
                                fVar89 * fVar103 + fVar85 * fVar70 + fVar82 * fVar66 +
                                fVar79 * fVar356 + fVar76 * fVar364 + fVar73 * fVar354 + fVar323;
                  pfVar316 = (float *)((long)pvVar305 + lVar297);
                  *pfVar316 = fVar236 * fVar256 +
                              fVar232 * fVar252 + fVar228 * fVar248 + fVar224 * fVar244 +
                              fVar220 * fVar240 +
                              fVar196 * fVar216 +
                              fVar192 * fVar212 +
                              fVar188 * fVar208 + fVar184 * fVar204 + fVar180 * fVar200 +
                              fVar156 * fVar176 +
                              fVar152 * fVar172 +
                              fVar148 * fVar168 + fVar144 * fVar164 + fVar140 * fVar160 +
                              fVar116 * fVar136 +
                              fVar112 * fVar132 + fVar108 * fVar128 + fVar104 * fVar124 +
                              fVar100 * fVar120 + fVar67 * fVar360 + fVar340 * fVar98 +
                              fVar342 * fVar94 + fVar361 * fVar90 + fVar330 * fVar86 + fVar320;
                  pfVar316[1] = fVar237 * fVar257 +
                                fVar233 * fVar253 + fVar229 * fVar249 + fVar225 * fVar245 +
                                fVar221 * fVar241 +
                                fVar197 * fVar217 +
                                fVar193 * fVar213 +
                                fVar189 * fVar209 + fVar185 * fVar205 + fVar181 * fVar201 +
                                fVar157 * fVar177 +
                                fVar153 * fVar173 +
                                fVar149 * fVar169 + fVar145 * fVar165 + fVar141 * fVar161 +
                                fVar117 * fVar137 +
                                fVar113 * fVar133 + fVar109 * fVar129 + fVar105 * fVar125 +
                                fVar101 * fVar121 + fVar68 * fVar341 + fVar64 * fVar357 +
                                fVar353 * fVar95 + fVar362 * fVar91 + fVar343 * fVar87 + fVar321;
                  pfVar316[2] = fVar238 * fVar258 +
                                fVar234 * fVar254 + fVar230 * fVar250 + fVar226 * fVar246 +
                                fVar222 * fVar242 +
                                fVar198 * fVar218 +
                                fVar194 * fVar214 +
                                fVar190 * fVar210 + fVar186 * fVar206 + fVar182 * fVar202 +
                                fVar158 * fVar178 +
                                fVar154 * fVar174 +
                                fVar150 * fVar170 + fVar146 * fVar166 + fVar142 * fVar162 +
                                fVar118 * fVar138 +
                                fVar114 * fVar134 + fVar110 * fVar130 + fVar106 * fVar126 +
                                fVar102 * fVar122 + fVar69 * fVar352 + fVar65 * fVar358 +
                                fVar355 * fVar96 + fVar363 * fVar92 + fVar335 * fVar88 + fVar322;
                  pfVar316[3] = fVar239 * fVar259 +
                                fVar235 * fVar255 + fVar231 * fVar251 + fVar227 * fVar247 +
                                fVar223 * fVar243 +
                                fVar199 * fVar219 +
                                fVar195 * fVar215 +
                                fVar191 * fVar211 + fVar187 * fVar207 + fVar183 * fVar203 +
                                fVar159 * fVar179 +
                                fVar155 * fVar175 +
                                fVar151 * fVar171 + fVar147 * fVar167 + fVar143 * fVar163 +
                                fVar119 * fVar139 +
                                fVar115 * fVar135 + fVar111 * fVar131 + fVar107 * fVar127 +
                                fVar103 * fVar123 + fVar70 * fVar99 + fVar66 * fVar359 +
                                fVar356 * fVar97 + fVar364 * fVar93 + fVar354 * fVar89 + fVar323;
                  lVar297 = lVar297 + 0x10;
                }
                piVar319 = (pointer)((long)piVar319 + lVar297 + lVar291);
                piVar311 = (pointer)((long)piVar311 + lVar297 + lVar291);
                pvVar292 = (void *)((long)pvVar292 + lVar297 + lVar291);
                pvVar294 = (void *)((long)pvVar294 + lVar297 + lVar291);
                piVar309 = (pointer)((long)piVar309 + lVar297 + lVar291);
                pvVar284 = (void *)((long)pvVar284 + lVar297 + lVar291);
                pvVar308 = (void *)((long)pvVar308 + lVar297 + lVar299);
                pvVar305 = (void *)((long)pvVar305 + lVar297 + lVar299);
              }
              for (; (int)uVar295 < iVar281; uVar295 = uVar295 + 1) {
                lVar297 = 0;
                uVar287 = uVar314;
                while (iVar306 = (int)uVar287, uVar287 = (ulong)(iVar306 - 1), iVar306 != 0) {
                  pfVar316 = (float *)((long)pvVar57 + lVar307);
                  pfVar288 = (float *)((long)pvVar57 + lVar307 + 0x10);
                  pfVar310 = (float *)((long)pvVar57 + lVar307 + 0x20);
                  pfVar4 = (float *)((long)pvVar57 + lVar307 + 0x30);
                  pfVar315 = (float *)((long)piVar319 + lVar297);
                  pfVar5 = (float *)((long)pvVar57 + lVar307 + 0x40);
                  pfVar27 = (float *)((long)piVar319 + lVar297 + 0x10);
                  pfVar28 = (float *)((long)piVar319 + lVar297 + 0x20);
                  pfVar6 = (float *)((long)piVar319 + lVar297 + 0x30);
                  pfVar7 = (float *)((long)piVar319 + lVar297 + 0x40);
                  pfVar8 = (float *)((long)pvVar57 + lVar307 + 0x50);
                  pfVar9 = (float *)((long)pvVar57 + lVar307 + 0x60);
                  pfVar10 = (float *)((long)pvVar57 + lVar307 + 0x70);
                  pfVar31 = (float *)((long)pvVar57 + lVar307 + 0x80);
                  pfVar32 = (float *)((long)pvVar57 + lVar307 + 0x90);
                  pfVar293 = (float *)((long)piVar311 + lVar297);
                  pfVar11 = (float *)((long)piVar311 + lVar297 + 0x10);
                  pfVar12 = (float *)((long)piVar311 + lVar297 + 0x20);
                  pfVar13 = (float *)((long)piVar311 + lVar297 + 0x30);
                  pfVar14 = (float *)((long)piVar311 + lVar297 + 0x40);
                  pfVar33 = (float *)((long)pvVar57 + lVar307 + 0xa0);
                  pfVar34 = (float *)((long)pvVar57 + lVar307 + 0xb0);
                  pfVar35 = (float *)((long)pvVar57 + lVar307 + 0xc0);
                  pfVar36 = (float *)((long)pvVar57 + lVar307 + 0xd0);
                  pfVar29 = (float *)((long)pvVar292 + lVar297);
                  pfVar37 = (float *)((long)pvVar57 + lVar307 + 0xe0);
                  pfVar15 = (float *)((long)pvVar292 + lVar297 + 0x10);
                  pfVar16 = (float *)((long)pvVar292 + lVar297 + 0x20);
                  pfVar17 = (float *)((long)pvVar292 + lVar297 + 0x30);
                  pfVar18 = (float *)((long)pvVar292 + lVar297 + 0x40);
                  pfVar38 = (float *)((long)pvVar57 + lVar307 + 0xf0);
                  pfVar39 = (float *)((long)pvVar57 + lVar307 + 0x100);
                  pfVar40 = (float *)((long)pvVar57 + lVar307 + 0x110);
                  pfVar41 = (float *)((long)pvVar57 + lVar307 + 0x120);
                  pfVar30 = (float *)((long)pvVar294 + lVar297);
                  pfVar42 = (float *)((long)pvVar57 + lVar307 + 0x130);
                  pfVar19 = (float *)((long)pvVar294 + lVar297 + 0x10);
                  pfVar20 = (float *)((long)pvVar294 + lVar297 + 0x20);
                  pfVar21 = (float *)((long)pvVar294 + lVar297 + 0x30);
                  pfVar22 = (float *)((long)pvVar294 + lVar297 + 0x40);
                  pfVar43 = (float *)((long)pvVar57 + lVar307 + 0x140);
                  pfVar44 = (float *)((long)pvVar57 + lVar307 + 0x150);
                  pfVar45 = (float *)((long)pvVar57 + lVar307 + 0x160);
                  pfVar46 = (float *)((long)pvVar57 + lVar307 + 0x170);
                  pfVar47 = (float *)((long)pvVar57 + lVar307 + 0x180);
                  pfVar317 = (float *)((long)piVar309 + lVar297);
                  pfVar23 = (float *)((long)piVar309 + lVar297 + 0x10);
                  pfVar24 = (float *)((long)piVar309 + lVar297 + 0x20);
                  pfVar25 = (float *)((long)piVar309 + lVar297 + 0x30);
                  pfVar26 = (float *)((long)piVar309 + lVar297 + 0x40);
                  auVar344._0_4_ =
                       *pfVar47 * *pfVar26 +
                       *pfVar46 * *pfVar25 + *pfVar45 * *pfVar24 + *pfVar44 * *pfVar23 +
                       *pfVar43 * *pfVar317 +
                       *pfVar42 * *pfVar22 +
                       *pfVar41 * *pfVar21 +
                       *pfVar40 * *pfVar20 + *pfVar39 * *pfVar19 + *pfVar38 * *pfVar30 +
                       *pfVar37 * *pfVar18 +
                       *pfVar36 * *pfVar17 +
                       *pfVar35 * *pfVar16 + *pfVar34 * *pfVar15 + *pfVar33 * *pfVar29 +
                       *pfVar32 * *pfVar14 +
                       *pfVar31 * *pfVar13 + *pfVar10 * *pfVar12 + *pfVar9 * *pfVar11 +
                       *pfVar8 * *pfVar293 + *pfVar5 * *pfVar7 + *pfVar4 * *pfVar6 +
                       *pfVar310 * *pfVar28 + *pfVar288 * *pfVar27 + *pfVar316 * *pfVar315 + fVar320
                  ;
                  auVar344._4_4_ =
                       pfVar47[1] * pfVar26[1] +
                       pfVar46[1] * pfVar25[1] + pfVar45[1] * pfVar24[1] + pfVar44[1] * pfVar23[1] +
                       pfVar43[1] * pfVar317[1] +
                       pfVar42[1] * pfVar22[1] +
                       pfVar41[1] * pfVar21[1] +
                       pfVar40[1] * pfVar20[1] + pfVar39[1] * pfVar19[1] + pfVar38[1] * pfVar30[1] +
                       pfVar37[1] * pfVar18[1] +
                       pfVar36[1] * pfVar17[1] +
                       pfVar35[1] * pfVar16[1] + pfVar34[1] * pfVar15[1] + pfVar33[1] * pfVar29[1] +
                       pfVar32[1] * pfVar14[1] +
                       pfVar31[1] * pfVar13[1] + pfVar10[1] * pfVar12[1] + pfVar9[1] * pfVar11[1] +
                       pfVar8[1] * pfVar293[1] + pfVar5[1] * pfVar7[1] + pfVar4[1] * pfVar6[1] +
                       pfVar310[1] * pfVar28[1] + pfVar288[1] * pfVar27[1] +
                       pfVar316[1] * pfVar315[1] + fVar321;
                  auVar344._8_4_ =
                       pfVar47[2] * pfVar26[2] +
                       pfVar46[2] * pfVar25[2] + pfVar45[2] * pfVar24[2] + pfVar44[2] * pfVar23[2] +
                       pfVar43[2] * pfVar317[2] +
                       pfVar42[2] * pfVar22[2] +
                       pfVar41[2] * pfVar21[2] +
                       pfVar40[2] * pfVar20[2] + pfVar39[2] * pfVar19[2] + pfVar38[2] * pfVar30[2] +
                       pfVar37[2] * pfVar18[2] +
                       pfVar36[2] * pfVar17[2] +
                       pfVar35[2] * pfVar16[2] + pfVar34[2] * pfVar15[2] + pfVar33[2] * pfVar29[2] +
                       pfVar32[2] * pfVar14[2] +
                       pfVar31[2] * pfVar13[2] + pfVar10[2] * pfVar12[2] + pfVar9[2] * pfVar11[2] +
                       pfVar8[2] * pfVar293[2] + pfVar5[2] * pfVar7[2] + pfVar4[2] * pfVar6[2] +
                       pfVar310[2] * pfVar28[2] + pfVar288[2] * pfVar27[2] +
                       pfVar316[2] * pfVar315[2] + fVar322;
                  auVar344._12_4_ =
                       pfVar47[3] * pfVar26[3] +
                       pfVar46[3] * pfVar25[3] + pfVar45[3] * pfVar24[3] + pfVar44[3] * pfVar23[3] +
                       pfVar43[3] * pfVar317[3] +
                       pfVar42[3] * pfVar22[3] +
                       pfVar41[3] * pfVar21[3] +
                       pfVar40[3] * pfVar20[3] + pfVar39[3] * pfVar19[3] + pfVar38[3] * pfVar30[3] +
                       pfVar37[3] * pfVar18[3] +
                       pfVar36[3] * pfVar17[3] +
                       pfVar35[3] * pfVar16[3] + pfVar34[3] * pfVar15[3] + pfVar33[3] * pfVar29[3] +
                       pfVar32[3] * pfVar14[3] +
                       pfVar31[3] * pfVar13[3] + pfVar10[3] * pfVar12[3] + pfVar9[3] * pfVar11[3] +
                       pfVar8[3] * pfVar293[3] + pfVar5[3] * pfVar7[3] + pfVar4[3] * pfVar6[3] +
                       pfVar310[3] * pfVar28[3] + pfVar288[3] * pfVar27[3] +
                       pfVar316[3] * pfVar315[3] + fVar323;
                  *(undefined1 (*) [16])((long)pvVar308 + lVar297) = auVar344;
                  lVar297 = lVar297 + 0x10;
                }
                piVar319 = (pointer)((long)piVar319 + lVar297 + 0x40);
                piVar311 = (pointer)((long)piVar311 + lVar297 + 0x40);
                pvVar292 = (void *)((long)pvVar292 + lVar297 + 0x40);
                pvVar294 = (void *)((long)pvVar294 + lVar297 + 0x40);
                piVar309 = (pointer)((long)piVar309 + lVar297 + 0x40);
                pvVar308 = (void *)((long)pvVar308 + lVar297);
              }
            }
          }
          else {
            iVar286 = 5;
            if ((((*(int *)(&this->field_0xdc + (long)p_Var290) != 1) ||
                 (*(int *)(&this->field_0xe0 + (long)p_Var290) != 1)) ||
                (*(int *)(&this->field_0xe4 + (long)p_Var290) != 2)) ||
               (*(int *)(&this->field_0xe8 + (long)p_Var290) != 2)) goto LAB_003d2126;
            uVar295 = top_blob->w;
            lVar300 = *(long *)(&this->field_0x1b0 + (long)p_Var290);
            uVar298 = 0;
            uVar314 = (ulong)uVar295;
            if ((int)uVar295 < 1) {
              uVar314 = uVar298;
            }
            uVar287 = (ulong)(uint)top_blob->h;
            if (top_blob->h < 1) {
              uVar287 = uVar298;
            }
            uVar289 = (ulong)(uint)local_248.c;
            if (local_248.c < 1) {
              uVar289 = uVar298;
            }
            lVar299 = (long)(int)((local_248.w - uVar295) * 8) * 4;
            for (; uVar298 != uVar289; uVar298 = uVar298 + 1) {
              if (lVar300 == 0) {
                fVar320 = 0.0;
                fVar321 = 0.0;
                fVar322 = 0.0;
                fVar323 = 0.0;
              }
              else {
                pfVar316 = (float *)(lVar300 + uVar298 * 0x10);
                fVar320 = *pfVar316;
                fVar321 = pfVar316[1];
                fVar322 = pfVar316[2];
                fVar323 = pfVar316[3];
              }
              pauVar304 = (undefined1 (*) [16])
                          (top_blob->cstep * uVar298 * top_blob->elemsize + (long)top_blob->data);
              pvVar57 = (this->weight_data_tm).data;
              lVar297 = (long)(this->weight_data_tm).w * uVar298 * (this->weight_data_tm).elemsize;
              piVar319 = (pointer)(local_248.cstep * uVar298 *
                                   CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize)
                                  + (long)local_248.data);
              lVar291 = (long)local_248.w *
                        CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
              piVar311 = (pointer)((long)piVar319 + lVar291);
              pvVar292 = (void *)((long)piVar319 + lVar291 * 2);
              pvVar284 = (void *)(lVar291 * 3 + (long)piVar319);
              piVar309 = piVar319 + lVar291;
              for (iVar281 = 0; iVar281 != (int)uVar287; iVar281 = iVar281 + 1) {
                lVar291 = 0;
                uVar285 = uVar314;
                while (iVar306 = (int)uVar285, uVar285 = (ulong)(iVar306 - 1), iVar306 != 0) {
                  pfVar316 = (float *)((long)pvVar57 + lVar297);
                  pfVar288 = (float *)((long)pvVar57 + lVar297 + 0x10);
                  pfVar310 = (float *)((long)pvVar57 + lVar297 + 0x20);
                  pfVar4 = (float *)((long)pvVar57 + lVar297 + 0x30);
                  pfVar5 = (float *)((long)pvVar57 + lVar297 + 0x40);
                  pfVar315 = (float *)((long)piVar319 + lVar291);
                  pfVar27 = (float *)((long)piVar319 + lVar291 + 0x10);
                  pfVar28 = (float *)((long)piVar319 + lVar291 + 0x20);
                  pfVar6 = (float *)((long)piVar319 + lVar291 + 0x30);
                  pfVar7 = (float *)((long)piVar319 + lVar291 + 0x40);
                  pfVar8 = (float *)((long)pvVar57 + lVar297 + 0x50);
                  pfVar9 = (float *)((long)pvVar57 + lVar297 + 0x60);
                  pfVar10 = (float *)((long)pvVar57 + lVar297 + 0x70);
                  pfVar31 = (float *)((long)pvVar57 + lVar297 + 0x80);
                  pfVar32 = (float *)((long)pvVar57 + lVar297 + 0x90);
                  pfVar293 = (float *)((long)piVar311 + lVar291);
                  pfVar11 = (float *)((long)piVar311 + lVar291 + 0x10);
                  pfVar12 = (float *)((long)piVar311 + lVar291 + 0x20);
                  pfVar13 = (float *)((long)piVar311 + lVar291 + 0x30);
                  pfVar14 = (float *)((long)piVar311 + lVar291 + 0x40);
                  pfVar33 = (float *)((long)pvVar57 + lVar297 + 0xa0);
                  pfVar34 = (float *)((long)pvVar57 + lVar297 + 0xb0);
                  pfVar35 = (float *)((long)pvVar57 + lVar297 + 0xc0);
                  pfVar36 = (float *)((long)pvVar57 + lVar297 + 0xd0);
                  pfVar37 = (float *)((long)pvVar57 + lVar297 + 0xe0);
                  pfVar317 = (float *)((long)pvVar292 + lVar291);
                  pfVar15 = (float *)((long)pvVar292 + lVar291 + 0x10);
                  pfVar16 = (float *)((long)pvVar292 + lVar291 + 0x20);
                  pfVar17 = (float *)((long)pvVar292 + lVar291 + 0x30);
                  pfVar18 = (float *)((long)pvVar292 + lVar291 + 0x40);
                  pfVar38 = (float *)((long)pvVar57 + lVar297 + 0xf0);
                  pfVar39 = (float *)((long)pvVar57 + lVar297 + 0x100);
                  pfVar40 = (float *)((long)pvVar57 + lVar297 + 0x110);
                  pfVar41 = (float *)((long)pvVar57 + lVar297 + 0x120);
                  pfVar42 = (float *)((long)pvVar57 + lVar297 + 0x130);
                  pfVar29 = (float *)((long)pvVar284 + lVar291);
                  pfVar19 = (float *)((long)pvVar284 + lVar291 + 0x10);
                  pfVar20 = (float *)((long)pvVar284 + lVar291 + 0x20);
                  pfVar21 = (float *)((long)pvVar284 + lVar291 + 0x30);
                  pfVar22 = (float *)((long)pvVar284 + lVar291 + 0x40);
                  pfVar43 = (float *)((long)pvVar57 + lVar297 + 0x140);
                  pfVar44 = (float *)((long)pvVar57 + lVar297 + 0x150);
                  pfVar45 = (float *)((long)pvVar57 + lVar297 + 0x160);
                  pfVar46 = (float *)((long)pvVar57 + lVar297 + 0x170);
                  pfVar47 = (float *)((long)pvVar57 + lVar297 + 0x180);
                  pfVar30 = (float *)((long)piVar309 + lVar291);
                  pfVar23 = (float *)((long)piVar309 + lVar291 + 0x10);
                  pfVar24 = (float *)((long)piVar309 + lVar291 + 0x20);
                  pfVar25 = (float *)((long)piVar309 + lVar291 + 0x30);
                  pfVar26 = (float *)((long)piVar309 + lVar291 + 0x40);
                  auVar345._0_4_ =
                       *pfVar47 * *pfVar26 +
                       *pfVar46 * *pfVar25 + *pfVar45 * *pfVar24 + *pfVar44 * *pfVar23 +
                       *pfVar43 * *pfVar30 +
                       *pfVar42 * *pfVar22 +
                       *pfVar41 * *pfVar21 +
                       *pfVar40 * *pfVar20 + *pfVar39 * *pfVar19 + *pfVar38 * *pfVar29 +
                       *pfVar37 * *pfVar18 +
                       *pfVar36 * *pfVar17 +
                       *pfVar35 * *pfVar16 + *pfVar34 * *pfVar15 + *pfVar33 * *pfVar317 +
                       *pfVar32 * *pfVar14 +
                       *pfVar31 * *pfVar13 + *pfVar10 * *pfVar12 + *pfVar9 * *pfVar11 +
                       *pfVar8 * *pfVar293 + *pfVar5 * *pfVar7 + *pfVar4 * *pfVar6 +
                       *pfVar310 * *pfVar28 + *pfVar288 * *pfVar27 + *pfVar316 * *pfVar315 + fVar320
                  ;
                  auVar345._4_4_ =
                       pfVar47[1] * pfVar26[1] +
                       pfVar46[1] * pfVar25[1] + pfVar45[1] * pfVar24[1] + pfVar44[1] * pfVar23[1] +
                       pfVar43[1] * pfVar30[1] +
                       pfVar42[1] * pfVar22[1] +
                       pfVar41[1] * pfVar21[1] +
                       pfVar40[1] * pfVar20[1] + pfVar39[1] * pfVar19[1] + pfVar38[1] * pfVar29[1] +
                       pfVar37[1] * pfVar18[1] +
                       pfVar36[1] * pfVar17[1] +
                       pfVar35[1] * pfVar16[1] + pfVar34[1] * pfVar15[1] + pfVar33[1] * pfVar317[1]
                       + pfVar32[1] * pfVar14[1] +
                         pfVar31[1] * pfVar13[1] + pfVar10[1] * pfVar12[1] + pfVar9[1] * pfVar11[1]
                         + pfVar8[1] * pfVar293[1] + pfVar5[1] * pfVar7[1] + pfVar4[1] * pfVar6[1] +
                           pfVar310[1] * pfVar28[1] + pfVar288[1] * pfVar27[1] +
                           pfVar316[1] * pfVar315[1] + fVar321;
                  auVar345._8_4_ =
                       pfVar47[2] * pfVar26[2] +
                       pfVar46[2] * pfVar25[2] + pfVar45[2] * pfVar24[2] + pfVar44[2] * pfVar23[2] +
                       pfVar43[2] * pfVar30[2] +
                       pfVar42[2] * pfVar22[2] +
                       pfVar41[2] * pfVar21[2] +
                       pfVar40[2] * pfVar20[2] + pfVar39[2] * pfVar19[2] + pfVar38[2] * pfVar29[2] +
                       pfVar37[2] * pfVar18[2] +
                       pfVar36[2] * pfVar17[2] +
                       pfVar35[2] * pfVar16[2] + pfVar34[2] * pfVar15[2] + pfVar33[2] * pfVar317[2]
                       + pfVar32[2] * pfVar14[2] +
                         pfVar31[2] * pfVar13[2] + pfVar10[2] * pfVar12[2] + pfVar9[2] * pfVar11[2]
                         + pfVar8[2] * pfVar293[2] + pfVar5[2] * pfVar7[2] + pfVar4[2] * pfVar6[2] +
                           pfVar310[2] * pfVar28[2] + pfVar288[2] * pfVar27[2] +
                           pfVar316[2] * pfVar315[2] + fVar322;
                  auVar345._12_4_ =
                       pfVar47[3] * pfVar26[3] +
                       pfVar46[3] * pfVar25[3] + pfVar45[3] * pfVar24[3] + pfVar44[3] * pfVar23[3] +
                       pfVar43[3] * pfVar30[3] +
                       pfVar42[3] * pfVar22[3] +
                       pfVar41[3] * pfVar21[3] +
                       pfVar40[3] * pfVar20[3] + pfVar39[3] * pfVar19[3] + pfVar38[3] * pfVar29[3] +
                       pfVar37[3] * pfVar18[3] +
                       pfVar36[3] * pfVar17[3] +
                       pfVar35[3] * pfVar16[3] + pfVar34[3] * pfVar15[3] + pfVar33[3] * pfVar317[3]
                       + pfVar32[3] * pfVar14[3] +
                         pfVar31[3] * pfVar13[3] + pfVar10[3] * pfVar12[3] + pfVar9[3] * pfVar11[3]
                         + pfVar8[3] * pfVar293[3] + pfVar5[3] * pfVar7[3] + pfVar4[3] * pfVar6[3] +
                           pfVar310[3] * pfVar28[3] + pfVar288[3] * pfVar27[3] +
                           pfVar316[3] * pfVar315[3] + fVar323;
                  *pauVar304 = auVar345;
                  pauVar304 = pauVar304 + 1;
                  lVar291 = lVar291 + 0x20;
                }
                piVar319 = (pointer)((long)piVar319 + lVar291 + lVar299);
                piVar311 = (pointer)((long)piVar311 + lVar291 + lVar299);
                pvVar292 = (void *)((long)pvVar292 + lVar291 + lVar299);
                pvVar284 = (void *)((long)pvVar284 + lVar291 + lVar299);
                piVar309 = (pointer)((long)piVar309 + lVar291 + lVar299);
              }
            }
          }
          goto LAB_003d284b;
        }
      }
      else if ((iVar281 == 3) && (iVar286 == 3)) {
        if (((*(int *)(&this->field_0xdc + (long)p_Var290) == 1) &&
            ((*(int *)(&this->field_0xe0 + (long)p_Var290) == 1 &&
             (*(int *)(&this->field_0xe4 + (long)p_Var290) == 1)))) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var290) == 1)) {
          iVar281 = top_blob->w;
          lVar300 = *(long *)(&this->field_0x1b0 + (long)p_Var290);
          uVar298 = 0;
          uVar314 = (ulong)(uint)top_blob->h;
          if (top_blob->h < 1) {
            uVar314 = uVar298;
          }
          uVar287 = (ulong)(uint)local_248.c;
          if (local_248.c < 1) {
            uVar287 = uVar298;
          }
          for (; uVar298 != uVar287; uVar298 = uVar298 + 1) {
            if (lVar300 == 0) {
              fVar320 = 0.0;
              fVar321 = 0.0;
              fVar322 = 0.0;
              fVar323 = 0.0;
            }
            else {
              pfVar316 = (float *)(lVar300 + uVar298 * 0x10);
              fVar320 = *pfVar316;
              fVar321 = pfVar316[1];
              fVar322 = pfVar316[2];
              fVar323 = pfVar316[3];
            }
            pauVar304 = (undefined1 (*) [16])
                        (top_blob->cstep * uVar298 * top_blob->elemsize + (long)top_blob->data);
            pvVar292 = (this->weight_data_tm).data;
            lVar297 = (long)(this->weight_data_tm).w * uVar298 * (this->weight_data_tm).elemsize;
            pfVar315 = (float *)(local_248.cstep * uVar298 *
                                 CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                                (long)local_248.data);
            lVar307 = (long)local_248.w *
                      CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
            pfVar293 = (float *)(lVar307 * 2 + (long)pfVar315);
            uVar50 = *(undefined8 *)((long)pvVar292 + lVar297);
            uVar51 = ((undefined8 *)((long)pvVar292 + lVar297))[1];
            puVar1 = (undefined8 *)((long)pvVar292 + lVar297 + 0x10);
            uVar260 = *puVar1;
            uVar261 = puVar1[1];
            pauVar2 = (undefined1 (*) [12])((long)pvVar292 + lVar297 + 0x20);
            auVar273 = *pauVar2;
            auVar272 = *pauVar2;
            local_1e8 = (float)*(undefined8 *)*pauVar2;
            fStack_1e4 = (float)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
            fStack_1e0 = (float)*(undefined8 *)(*pauVar2 + 8);
            fStack_1dc = (float)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
            puVar1 = (undefined8 *)((long)pvVar292 + lVar297 + 0x30);
            uVar262 = *puVar1;
            uVar263 = puVar1[1];
            puVar1 = (undefined8 *)((long)pvVar292 + lVar297 + 0x40);
            uVar264 = *puVar1;
            uVar265 = puVar1[1];
            puVar1 = (undefined8 *)((long)pvVar292 + lVar297 + 0x50);
            uVar266 = *puVar1;
            uVar267 = puVar1[1];
            puVar1 = (undefined8 *)((long)pvVar292 + lVar297 + 0x60);
            uVar268 = *puVar1;
            uVar269 = puVar1[1];
            plVar3 = (long *)((long)pvVar292 + lVar297 + 0x70);
            lVar299 = *plVar3;
            lVar291 = plVar3[1];
            pfVar316 = (float *)((long)pvVar292 + lVar297 + 0x80);
            fVar330 = *pfVar316;
            fVar343 = pfVar316[1];
            uVar275 = *(undefined8 *)pfVar316;
            uVar274 = *(undefined8 *)pfVar316;
            fVar335 = pfVar316[2];
            fVar354 = pfVar316[3];
            pfVar316 = (float *)(lVar307 + (long)pfVar315);
            for (iVar306 = 0; iVar306 != (int)uVar314; iVar306 = iVar306 + 1) {
              pfVar317 = pfVar293 + 8;
              pfVar288 = pfVar316 + 8;
              pfVar310 = pfVar315 + 8;
              lVar297 = 0;
              iVar312 = 0;
              while( true ) {
                local_2d8 = (float)uVar50;
                fStack_2d4 = (float)((ulong)uVar50 >> 0x20);
                fStack_2d0 = (float)uVar51;
                fStack_2cc = (float)((ulong)uVar51 >> 0x20);
                local_2a8 = (float)uVar260;
                fStack_2a4 = (float)((ulong)uVar260 >> 0x20);
                fStack_2a0 = (float)uVar261;
                fStack_29c = (float)((ulong)uVar261 >> 0x20);
                local_268 = (float)uVar262;
                fStack_264 = (float)((ulong)uVar262 >> 0x20);
                fStack_260 = (float)uVar263;
                fStack_25c = (float)((ulong)uVar263 >> 0x20);
                local_2c8 = (float)uVar264;
                fStack_2c4 = (float)((ulong)uVar264 >> 0x20);
                fStack_2c0 = (float)uVar265;
                fStack_2bc = (float)((ulong)uVar265 >> 0x20);
                local_258 = (float)uVar266;
                fStack_254 = (float)((ulong)uVar266 >> 0x20);
                fStack_250 = (float)uVar267;
                fStack_24c = (float)((ulong)uVar267 >> 0x20);
                local_298 = (float)uVar268;
                fStack_294 = (float)((ulong)uVar268 >> 0x20);
                fStack_290 = (float)uVar269;
                fStack_28c = (float)((ulong)uVar269 >> 0x20);
                local_1f8._0_4_ = (float)lVar299;
                local_1f8._4_4_ = (float)((ulong)lVar299 >> 0x20);
                uStack_1f0._0_4_ = (float)lVar291;
                uStack_1f0._4_4_ = (float)((ulong)lVar291 >> 0x20);
                if (iVar281 <= iVar312 + 7) break;
                pfVar27 = (float *)((long)pfVar315 + lVar297);
                fVar361 = pfVar27[1];
                fVar362 = pfVar27[2];
                fVar363 = pfVar27[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x10);
                fVar364 = *pfVar4;
                fVar342 = pfVar4[1];
                fVar353 = pfVar4[2];
                fVar355 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x20);
                fVar356 = *pfVar4;
                fVar340 = pfVar4[1];
                fVar64 = pfVar4[2];
                fVar65 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x30);
                fVar66 = *pfVar4;
                fVar67 = pfVar4[1];
                fVar68 = pfVar4[2];
                fVar69 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297);
                fVar70 = pfVar4[1];
                fVar71 = pfVar4[2];
                fVar72 = pfVar4[3];
                pfVar5 = (float *)((long)pfVar316 + lVar297 + 0x10);
                fVar73 = *pfVar5;
                fVar74 = pfVar5[1];
                fVar75 = pfVar5[2];
                fVar76 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar316 + lVar297 + 0x20);
                fVar77 = *pfVar5;
                fVar78 = pfVar5[1];
                fVar79 = pfVar5[2];
                fVar80 = pfVar5[3];
                puVar1 = (undefined8 *)((long)pfVar316 + lVar297 + 0x30);
                uVar270 = *puVar1;
                uVar271 = puVar1[1];
                pfVar28 = (float *)((long)pfVar293 + lVar297);
                fVar81 = pfVar28[1];
                fVar82 = pfVar28[2];
                fVar83 = pfVar28[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x10);
                fVar84 = *pfVar5;
                fVar85 = pfVar5[1];
                fVar86 = pfVar5[2];
                fVar87 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x20);
                fVar88 = *pfVar5;
                fVar89 = pfVar5[1];
                fVar90 = pfVar5[2];
                fVar91 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x30);
                fVar92 = *pfVar5;
                fVar93 = pfVar5[1];
                fVar94 = pfVar5[2];
                fVar95 = pfVar5[3];
                pfVar5 = (float *)((long)*pauVar304 + lVar297);
                *pfVar5 = fVar88 * fVar330 + fVar84 * (float)local_1f8 + *pfVar28 * local_298 +
                          fVar77 * local_258 + fVar73 * local_2c8 + *pfVar4 * local_268 +
                          fVar356 * local_1e8 + fVar364 * local_2a8 + *pfVar27 * local_2d8 + fVar320
                ;
                pfVar5[1] = fVar89 * fVar343 + fVar85 * local_1f8._4_4_ + fVar81 * fStack_294 +
                            fVar78 * fStack_254 + fVar74 * fStack_2c4 + fVar70 * fStack_264 +
                            fVar340 * fStack_1e4 + fVar342 * fStack_2a4 +
                            fVar361 * fStack_2d4 + fVar321;
                pfVar5[2] = fVar90 * fVar335 + fVar86 * (float)uStack_1f0 + fVar82 * fStack_290 +
                            fVar79 * fStack_250 + fVar75 * fStack_2c0 + fVar71 * fStack_260 +
                            fVar64 * fStack_1e0 + fVar353 * fStack_2a0 +
                            fVar362 * fStack_2d0 + fVar322;
                pfVar5[3] = fVar91 * fVar354 + fVar87 * uStack_1f0._4_4_ + fVar83 * fStack_28c +
                            fVar80 * fStack_24c + fVar76 * fStack_2bc + fVar72 * fStack_25c +
                            fVar65 * fStack_1dc + fVar355 * fStack_29c +
                            fVar363 * fStack_2cc + fVar323;
                local_1d8._0_4_ = (float)uVar270;
                local_1d8._4_4_ = (float)((ulong)uVar270 >> 0x20);
                uStack_1d0._0_4_ = (float)uVar271;
                uStack_1d0._4_4_ = (float)((ulong)uVar271 >> 0x20);
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x40);
                fVar361 = *pfVar4;
                fVar362 = pfVar4[1];
                fVar363 = pfVar4[2];
                fVar70 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x40);
                fVar71 = *pfVar4;
                fVar72 = pfVar4[1];
                fVar81 = pfVar4[2];
                fVar82 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x40);
                fVar83 = *pfVar4;
                fVar96 = pfVar4[1];
                fVar97 = pfVar4[2];
                fVar98 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[1] + lVar297);
                *pfVar4 = fVar92 * fVar330 + (float)local_1d8 * local_258 + fVar66 * local_1e8 +
                          fVar88 * (float)local_1f8 + fVar84 * local_298 + fVar77 * local_2c8 +
                          fVar73 * local_268 + fVar356 * local_2a8 + fVar364 * local_2d8 + fVar320;
                pfVar4[1] = fVar93 * fVar343 + local_1d8._4_4_ * fStack_254 + fVar67 * fStack_1e4 +
                            fVar89 * local_1f8._4_4_ + fVar85 * fStack_294 + fVar78 * fStack_2c4 +
                            fVar74 * fStack_264 + fVar340 * fStack_2a4 +
                            fVar342 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar94 * fVar335 + (float)uStack_1d0 * fStack_250 + fVar68 * fStack_1e0
                            + fVar90 * (float)uStack_1f0 + fVar86 * fStack_290 + fVar79 * fStack_2c0
                              + fVar75 * fStack_260 + fVar64 * fStack_2a0 +
                                fVar353 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar95 * fVar354 + uStack_1d0._4_4_ * fStack_24c + fVar69 * fStack_1dc +
                            fVar91 * uStack_1f0._4_4_ + fVar87 * fStack_28c + fVar80 * fStack_2bc +
                            fVar76 * fStack_25c + fVar65 * fStack_29c +
                            fVar355 * fStack_2cc + fVar323;
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x50);
                fVar364 = *pfVar4;
                fVar342 = pfVar4[1];
                fVar353 = pfVar4[2];
                fVar355 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x50);
                fVar73 = *pfVar4;
                fVar74 = pfVar4[1];
                fVar75 = pfVar4[2];
                fVar76 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x50);
                fVar84 = *pfVar4;
                fVar85 = pfVar4[1];
                fVar86 = pfVar4[2];
                fVar87 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[2] + lVar297);
                *pfVar4 = fVar83 * fVar330 + fVar71 * local_258 + fVar361 * local_1e8 +
                          fVar92 * (float)local_1f8 +
                          (float)local_1d8 * local_2c8 + fVar66 * local_2a8 +
                          fVar88 * local_298 + fVar77 * local_268 + fVar356 * local_2d8 + fVar320;
                pfVar4[1] = fVar96 * fVar343 + fVar72 * fStack_254 + fVar362 * fStack_1e4 +
                            fVar93 * local_1f8._4_4_ +
                            local_1d8._4_4_ * fStack_2c4 + fVar67 * fStack_2a4 +
                            fVar89 * fStack_294 + fVar78 * fStack_264 +
                            fVar340 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar97 * fVar335 + fVar81 * fStack_250 + fVar363 * fStack_1e0 +
                            fVar94 * (float)uStack_1f0 +
                            (float)uStack_1d0 * fStack_2c0 + fVar68 * fStack_2a0 +
                            fVar90 * fStack_290 + fVar79 * fStack_260 +
                            fVar64 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar98 * fVar354 + fVar82 * fStack_24c + fVar70 * fStack_1dc +
                            fVar95 * uStack_1f0._4_4_ +
                            uStack_1d0._4_4_ * fStack_2bc + fVar69 * fStack_29c +
                            fVar91 * fStack_28c + fVar80 * fStack_25c +
                            fVar65 * fStack_2cc + fVar323;
                fVar357 = (float)local_1d8 * local_268;
                fVar358 = local_1d8._4_4_ * fStack_264;
                fVar359 = (float)uStack_1d0 * fStack_260;
                fVar360 = uStack_1d0._4_4_ * fStack_25c;
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x60);
                fVar356 = *pfVar4;
                fVar340 = pfVar4[1];
                fVar64 = pfVar4[2];
                fVar65 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x60);
                fVar77 = *pfVar4;
                fVar78 = pfVar4[1];
                local_1d8 = *(long *)pfVar4;
                fVar79 = pfVar4[2];
                fVar80 = pfVar4[3];
                uStack_1d0 = *(long *)(pfVar4 + 2);
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x60);
                fVar88 = *pfVar4;
                fVar89 = pfVar4[1];
                fVar90 = pfVar4[2];
                fVar91 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[3] + lVar297);
                *pfVar4 = fVar84 * fVar330 + fVar73 * local_258 + fVar364 * local_1e8 +
                          fVar83 * (float)local_1f8 + fVar71 * local_2c8 + fVar361 * local_2a8 +
                          fVar92 * local_298 + fVar357 + fVar66 * local_2d8 + fVar320;
                pfVar4[1] = fVar85 * fVar343 + fVar74 * fStack_254 + fVar342 * fStack_1e4 +
                            fVar96 * local_1f8._4_4_ + fVar72 * fStack_2c4 + fVar362 * fStack_2a4 +
                            fVar93 * fStack_294 + fVar358 + fVar67 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar86 * fVar335 + fVar75 * fStack_250 + fVar353 * fStack_1e0 +
                            fVar97 * (float)uStack_1f0 + fVar81 * fStack_2c0 + fVar363 * fStack_2a0
                            + fVar94 * fStack_290 + fVar359 + fVar68 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar87 * fVar354 + fVar76 * fStack_24c + fVar355 * fStack_1dc +
                            fVar98 * uStack_1f0._4_4_ + fVar82 * fStack_2bc + fVar70 * fStack_29c +
                            fVar95 * fStack_28c + fVar360 + fVar69 * fStack_2cc + fVar323;
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x70);
                fVar66 = *pfVar4;
                fVar67 = pfVar4[1];
                fVar68 = pfVar4[2];
                fVar69 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x70);
                fVar92 = *pfVar4;
                fVar93 = pfVar4[1];
                fVar94 = pfVar4[2];
                fVar95 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x70);
                fVar357 = *pfVar4;
                fVar358 = pfVar4[1];
                fVar359 = pfVar4[2];
                fVar360 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[4] + lVar297);
                *pfVar4 = fVar88 * fVar330 + fVar77 * local_258 + fVar356 * local_1e8 +
                          fVar84 * (float)local_1f8 + fVar73 * local_2c8 + fVar364 * local_2a8 +
                          fVar83 * local_298 + fVar71 * local_268 + fVar361 * local_2d8 + fVar320;
                pfVar4[1] = fVar89 * fVar343 + fVar78 * fStack_254 + fVar340 * fStack_1e4 +
                            fVar85 * local_1f8._4_4_ + fVar74 * fStack_2c4 + fVar342 * fStack_2a4 +
                            fVar96 * fStack_294 + fVar72 * fStack_264 +
                            fVar362 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar90 * fVar335 + fVar79 * fStack_250 + fVar64 * fStack_1e0 +
                            fVar86 * (float)uStack_1f0 + fVar75 * fStack_2c0 + fVar353 * fStack_2a0
                            + fVar97 * fStack_290 + fVar81 * fStack_260 +
                              fVar363 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar91 * fVar354 + fVar80 * fStack_24c + fVar65 * fStack_1dc +
                            fVar87 * uStack_1f0._4_4_ + fVar76 * fStack_2bc + fVar355 * fStack_29c +
                            fVar98 * fStack_28c + fVar82 * fStack_25c +
                            fVar70 * fStack_2cc + fVar323;
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x80);
                fVar361 = *pfVar4;
                fVar362 = pfVar4[1];
                fVar363 = pfVar4[2];
                fVar70 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x80);
                fVar71 = *pfVar4;
                fVar72 = pfVar4[1];
                fVar81 = pfVar4[2];
                fVar82 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x80);
                fVar83 = *pfVar4;
                fVar96 = pfVar4[1];
                fVar97 = pfVar4[2];
                fVar98 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[5] + lVar297);
                *pfVar4 = fVar357 * fVar330 + fVar92 * local_258 + fVar66 * local_1e8 +
                          fVar88 * (float)local_1f8 + fVar77 * local_2c8 + fVar356 * local_2a8 +
                          fVar84 * local_298 + fVar73 * local_268 + fVar364 * local_2d8 + fVar320;
                pfVar4[1] = fVar358 * fVar343 + fVar93 * fStack_254 + fVar67 * fStack_1e4 +
                            fVar89 * local_1f8._4_4_ + fVar78 * fStack_2c4 + fVar340 * fStack_2a4 +
                            fVar85 * fStack_294 + fVar74 * fStack_264 +
                            fVar342 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar359 * fVar335 + fVar94 * fStack_250 + fVar68 * fStack_1e0 +
                            fVar90 * (float)uStack_1f0 + fVar79 * fStack_2c0 + fVar64 * fStack_2a0 +
                            fVar86 * fStack_290 + fVar75 * fStack_260 +
                            fVar353 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar360 * fVar354 + fVar95 * fStack_24c + fVar69 * fStack_1dc +
                            fVar91 * uStack_1f0._4_4_ + fVar80 * fStack_2bc + fVar65 * fStack_29c +
                            fVar87 * fStack_28c + fVar76 * fStack_25c +
                            fVar355 * fStack_2cc + fVar323;
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x90);
                fVar364 = *pfVar4;
                fVar342 = pfVar4[1];
                fVar353 = pfVar4[2];
                fVar355 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x90);
                fVar73 = *pfVar4;
                fVar74 = pfVar4[1];
                fVar75 = pfVar4[2];
                fVar76 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x90);
                fVar84 = *pfVar4;
                fVar85 = pfVar4[1];
                fVar86 = pfVar4[2];
                fVar87 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[6] + lVar297);
                *pfVar4 = fVar83 * fVar330 + fVar71 * local_258 + fVar361 * auVar272._0_4_ +
                          fVar357 * (float)local_1f8 + fVar92 * local_2c8 + fVar66 * local_2a8 +
                          fVar88 * local_298 + fVar77 * local_268 + fVar356 * local_2d8 + fVar320;
                pfVar4[1] = fVar96 * fVar343 + fVar72 * fStack_254 + fVar362 * auVar272._4_4_ +
                            fVar358 * local_1f8._4_4_ + fVar93 * fStack_2c4 + fVar67 * fStack_2a4 +
                            fVar89 * fStack_294 + fVar78 * fStack_264 +
                            fVar340 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar97 * fVar335 + fVar81 * fStack_250 + fVar363 * auVar272._8_4_ +
                            fVar359 * (float)uStack_1f0 + fVar94 * fStack_2c0 + fVar68 * fStack_2a0
                            + fVar90 * fStack_290 + fVar79 * fStack_260 +
                              fVar64 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar98 * fVar354 + fVar82 * fStack_24c + fVar70 * fStack_1dc +
                            fVar360 * uStack_1f0._4_4_ + fVar95 * fStack_2bc + fVar69 * fStack_29c +
                            fVar91 * fStack_28c + fVar80 * fStack_25c +
                            fVar65 * fStack_2cc + fVar323;
                pfVar4 = (float *)(pauVar304[7] + lVar297);
                *pfVar4 = fVar83 * (float)local_1f8 + fVar71 * local_2c8 + fVar361 * local_2a8 +
                          fVar357 * local_298 + fVar92 * local_268 + fVar66 * local_2d8 + fVar320 +
                          fVar84 * fVar330 + fVar73 * local_258 + fVar364 * auVar272._0_4_;
                pfVar4[1] = fVar96 * local_1f8._4_4_ + fVar72 * fStack_2c4 + fVar362 * fStack_2a4 +
                            fVar358 * fStack_294 + fVar93 * fStack_264 +
                            fVar67 * fStack_2d4 + fVar321 +
                            fVar85 * fVar343 + fVar74 * fStack_254 + fVar342 * auVar272._4_4_;
                pfVar4[2] = fVar97 * (float)uStack_1f0 + fVar81 * fStack_2c0 + fVar363 * fStack_2a0
                            + fVar359 * fStack_290 + fVar94 * fStack_260 +
                              fVar68 * fStack_2d0 + fVar322 +
                            fVar86 * fVar335 + fVar75 * fStack_250 + fVar353 * auVar272._8_4_;
                pfVar4[3] = fVar98 * uStack_1f0._4_4_ + fVar82 * fStack_2bc + fVar70 * fStack_29c +
                            fVar360 * fStack_28c + fVar95 * fStack_25c +
                            fVar69 * fStack_2cc + fVar323 +
                            fVar87 * fVar354 + fVar76 * fStack_24c + fVar355 * fStack_1dc;
                iVar312 = iVar312 + 8;
                lVar297 = lVar297 + 0x80;
                pfVar317 = pfVar317 + 0x20;
                pfVar288 = pfVar288 + 0x20;
                pfVar310 = pfVar310 + 0x20;
              }
              for (; iVar312 + 3 < iVar281; iVar312 = iVar312 + 4) {
                pfVar27 = (float *)((long)pfVar315 + lVar297);
                fVar361 = pfVar27[1];
                fVar362 = pfVar27[2];
                fVar363 = pfVar27[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x10);
                fVar364 = *pfVar4;
                fVar342 = pfVar4[1];
                fVar353 = pfVar4[2];
                fVar355 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x20);
                fVar356 = *pfVar4;
                fVar340 = pfVar4[1];
                fVar64 = pfVar4[2];
                fVar65 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x30);
                fVar66 = *pfVar4;
                fVar67 = pfVar4[1];
                fVar68 = pfVar4[2];
                fVar69 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297);
                fVar70 = pfVar4[1];
                fVar71 = pfVar4[2];
                fVar72 = pfVar4[3];
                pfVar5 = (float *)((long)pfVar316 + lVar297 + 0x10);
                fVar73 = *pfVar5;
                fVar74 = pfVar5[1];
                fVar75 = pfVar5[2];
                fVar76 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar316 + lVar297 + 0x20);
                fVar77 = *pfVar5;
                fVar78 = pfVar5[1];
                fVar79 = pfVar5[2];
                fVar80 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar316 + lVar297 + 0x30);
                fVar81 = *pfVar5;
                fVar82 = pfVar5[1];
                local_1d8 = *(long *)pfVar5;
                fVar83 = pfVar5[2];
                fVar84 = pfVar5[3];
                uStack_1d0 = *(long *)(pfVar5 + 2);
                pfVar28 = (float *)((long)pfVar293 + lVar297);
                fVar85 = pfVar28[1];
                fVar86 = pfVar28[2];
                fVar87 = pfVar28[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x10);
                fVar88 = *pfVar5;
                fVar89 = pfVar5[1];
                fVar90 = pfVar5[2];
                fVar91 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x20);
                fVar92 = *pfVar5;
                fVar93 = pfVar5[1];
                fVar94 = pfVar5[2];
                fVar95 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x30);
                fVar96 = *pfVar5;
                fVar97 = pfVar5[1];
                fVar98 = pfVar5[2];
                fVar357 = pfVar5[3];
                pfVar5 = (float *)((long)*pauVar304 + lVar297);
                *pfVar5 = fVar92 * fVar330 + fVar88 * (float)local_1f8 + *pfVar28 * local_298 +
                          fVar77 * local_258 + fVar73 * local_2c8 + *pfVar4 * local_268 +
                          fVar356 * local_1e8 + fVar364 * local_2a8 + *pfVar27 * local_2d8 + fVar320
                ;
                pfVar5[1] = fVar93 * fVar343 + fVar89 * local_1f8._4_4_ + fVar85 * fStack_294 +
                            fVar78 * fStack_254 + fVar74 * fStack_2c4 + fVar70 * fStack_264 +
                            fVar340 * fStack_1e4 + fVar342 * fStack_2a4 +
                            fVar361 * fStack_2d4 + fVar321;
                pfVar5[2] = fVar94 * fVar335 + fVar90 * (float)uStack_1f0 + fVar86 * fStack_290 +
                            fVar79 * fStack_250 + fVar75 * fStack_2c0 + fVar71 * fStack_260 +
                            fVar64 * fStack_1e0 + fVar353 * fStack_2a0 +
                            fVar362 * fStack_2d0 + fVar322;
                pfVar5[3] = fVar95 * fVar354 + fVar91 * uStack_1f0._4_4_ + fVar87 * fStack_28c +
                            fVar80 * fStack_24c + fVar76 * fStack_2bc + fVar72 * fStack_25c +
                            fVar65 * fStack_1dc + fVar355 * fStack_29c +
                            fVar363 * fStack_2cc + fVar323;
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x40);
                fVar361 = *pfVar4;
                fVar362 = pfVar4[1];
                fVar363 = pfVar4[2];
                fVar70 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x40);
                fVar71 = *pfVar4;
                fVar72 = pfVar4[1];
                fVar85 = pfVar4[2];
                fVar86 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x40);
                fVar87 = *pfVar4;
                fVar358 = pfVar4[1];
                fVar359 = pfVar4[2];
                fVar360 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[1] + lVar297);
                *pfVar4 = fVar96 * fVar330 + fVar81 * local_258 + fVar66 * local_1e8 +
                          fVar92 * (float)local_1f8 + fVar88 * local_298 + fVar77 * local_2c8 +
                          fVar73 * local_268 + fVar356 * local_2a8 + fVar364 * local_2d8 + fVar320;
                pfVar4[1] = fVar97 * fVar343 + fVar82 * fStack_254 + fVar67 * fStack_1e4 +
                            fVar93 * local_1f8._4_4_ + fVar89 * fStack_294 + fVar78 * fStack_2c4 +
                            fVar74 * fStack_264 + fVar340 * fStack_2a4 +
                            fVar342 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar98 * fVar335 + fVar83 * fStack_250 + fVar68 * fStack_1e0 +
                            fVar94 * (float)uStack_1f0 + fVar90 * fStack_290 + fVar79 * fStack_2c0 +
                            fVar75 * fStack_260 + fVar64 * fStack_2a0 +
                            fVar353 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar357 * fVar354 + fVar84 * fStack_24c + fVar69 * fStack_1dc +
                            fVar95 * uStack_1f0._4_4_ + fVar91 * fStack_28c + fVar80 * fStack_2bc +
                            fVar76 * fStack_25c + fVar65 * fStack_29c +
                            fVar355 * fStack_2cc + fVar323;
                fVar341 = (float)uVar274;
                fVar352 = (float)((ulong)uVar274 >> 0x20);
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x50);
                fVar364 = *pfVar4;
                fVar342 = pfVar4[1];
                fVar353 = pfVar4[2];
                fVar355 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x50);
                fVar73 = *pfVar4;
                fVar74 = pfVar4[1];
                fVar75 = pfVar4[2];
                fVar76 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x50);
                fVar88 = *pfVar4;
                fVar89 = pfVar4[1];
                fVar90 = pfVar4[2];
                fVar91 = pfVar4[3];
                pfVar4 = (float *)(pauVar304[2] + lVar297);
                *pfVar4 = fVar87 * fVar341 + fVar71 * local_258 + fVar361 * local_1e8 +
                          fVar96 * (float)local_1f8 + fVar81 * local_2c8 + fVar66 * local_2a8 +
                          fVar92 * local_298 + fVar77 * local_268 + fVar356 * local_2d8 + fVar320;
                pfVar4[1] = fVar358 * fVar352 + fVar72 * fStack_254 + fVar362 * fStack_1e4 +
                            fVar97 * local_1f8._4_4_ + fVar82 * fStack_2c4 + fVar67 * fStack_2a4 +
                            fVar93 * fStack_294 + fVar78 * fStack_264 +
                            fVar340 * fStack_2d4 + fVar321;
                pfVar4[2] = fVar359 * fVar335 + fVar85 * fStack_250 + fVar363 * fStack_1e0 +
                            fVar98 * (float)uStack_1f0 + fVar83 * fStack_2c0 + fVar68 * fStack_2a0 +
                            fVar94 * fStack_290 + fVar79 * fStack_260 +
                            fVar64 * fStack_2d0 + fVar322;
                pfVar4[3] = fVar360 * fVar354 + fVar86 * fStack_24c + fVar70 * fStack_1dc +
                            fVar357 * uStack_1f0._4_4_ + fVar84 * fStack_2bc + fVar69 * fStack_29c +
                            fVar95 * fStack_28c + fVar80 * fStack_25c +
                            fVar65 * fStack_2cc + fVar323;
                auVar331._0_4_ =
                     fVar87 * (float)local_1f8 + fVar71 * local_2c8 + fVar361 * local_2a8 +
                     fVar96 * local_298 + fVar81 * local_268 + fVar66 * local_2d8 + fVar320 +
                     fVar88 * fVar341 + fVar73 * local_258 + fVar364 * local_1e8;
                auVar331._4_4_ =
                     fVar358 * local_1f8._4_4_ + fVar72 * fStack_2c4 + fVar362 * fStack_2a4 +
                     fVar97 * fStack_294 + fVar82 * fStack_264 + fVar67 * fStack_2d4 + fVar321 +
                     fVar89 * fVar352 + fVar74 * fStack_254 + fVar342 * fStack_1e4;
                auVar331._8_4_ =
                     fVar359 * (float)uStack_1f0 + fVar85 * fStack_2c0 + fVar363 * fStack_2a0 +
                     fVar98 * fStack_290 + fVar83 * fStack_260 + fVar68 * fStack_2d0 + fVar322 +
                     fVar90 * fVar335 + fVar75 * fStack_250 + fVar353 * fStack_1e0;
                auVar331._12_4_ =
                     fVar360 * uStack_1f0._4_4_ + fVar86 * fStack_2bc + fVar70 * fStack_29c +
                     fVar357 * fStack_28c + fVar84 * fStack_25c + fVar69 * fStack_2cc + fVar323 +
                     fVar91 * fVar354 + fVar76 * fStack_24c + fVar355 * fStack_1dc;
                *(undefined1 (*) [16])(pauVar304[3] + lVar297) = auVar331;
                lVar297 = lVar297 + 0x40;
                pfVar317 = pfVar317 + 0x10;
                pfVar288 = pfVar288 + 0x10;
                pfVar310 = pfVar310 + 0x10;
              }
              for (; iVar312 + 1 < iVar281; iVar312 = iVar312 + 2) {
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x10);
                fVar361 = *pfVar4;
                fVar362 = pfVar4[1];
                fVar363 = pfVar4[2];
                fVar364 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar315 + lVar297 + 0x20);
                fVar342 = *pfVar4;
                fVar353 = pfVar4[1];
                fVar355 = pfVar4[2];
                fVar356 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x10);
                fVar340 = *pfVar4;
                fVar64 = pfVar4[1];
                fVar65 = pfVar4[2];
                fVar66 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297 + 0x20);
                fVar67 = *pfVar4;
                fVar68 = pfVar4[1];
                fVar69 = pfVar4[2];
                fVar70 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x10);
                fVar71 = *pfVar4;
                fVar72 = pfVar4[1];
                fVar73 = pfVar4[2];
                fVar74 = pfVar4[3];
                pfVar4 = (float *)((long)pfVar293 + lVar297 + 0x20);
                fVar75 = *pfVar4;
                fVar76 = pfVar4[1];
                fVar77 = pfVar4[2];
                fVar78 = pfVar4[3];
                pfVar27 = (float *)((long)pfVar315 + lVar297);
                fVar79 = pfVar27[1];
                fVar80 = pfVar27[2];
                fVar81 = pfVar27[3];
                pfVar4 = (float *)((long)pfVar316 + lVar297);
                fVar82 = pfVar4[1];
                fVar83 = pfVar4[2];
                fVar84 = pfVar4[3];
                pfVar28 = (float *)((long)pfVar293 + lVar297);
                fVar85 = pfVar28[1];
                fVar86 = pfVar28[2];
                fVar87 = pfVar28[3];
                fVar358 = (float)uVar275;
                fVar359 = (float)((ulong)uVar275 >> 0x20);
                pfVar5 = (float *)((long)pfVar315 + lVar297 + 0x30);
                fVar88 = *pfVar5;
                fVar89 = pfVar5[1];
                fVar90 = pfVar5[2];
                fVar91 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar316 + lVar297 + 0x30);
                fVar92 = *pfVar5;
                fVar93 = pfVar5[1];
                fVar94 = pfVar5[2];
                fVar95 = pfVar5[3];
                pfVar5 = (float *)((long)pfVar293 + lVar297 + 0x30);
                fVar96 = *pfVar5;
                fVar97 = pfVar5[1];
                fVar98 = pfVar5[2];
                fVar357 = pfVar5[3];
                pfVar5 = (float *)((long)*pauVar304 + lVar297);
                *pfVar5 = fVar75 * fVar358 + fVar71 * (float)local_1f8 + *pfVar28 * local_298 +
                          fVar67 * local_258 + fVar340 * local_2c8 + *pfVar4 * local_268 +
                          fVar342 * auVar273._0_4_ + fVar361 * local_2a8 +
                          *pfVar27 * local_2d8 + fVar320;
                pfVar5[1] = fVar76 * fVar359 + fVar72 * local_1f8._4_4_ + fVar85 * fStack_294 +
                            fVar68 * fStack_254 + fVar64 * fStack_2c4 + fVar82 * fStack_264 +
                            fVar353 * auVar273._4_4_ + fVar362 * fStack_2a4 +
                            fVar79 * fStack_2d4 + fVar321;
                pfVar5[2] = fVar77 * fVar335 + fVar73 * (float)uStack_1f0 + fVar86 * fStack_290 +
                            fVar69 * fStack_250 + fVar65 * fStack_2c0 + fVar83 * fStack_260 +
                            fVar355 * auVar273._8_4_ + fVar363 * fStack_2a0 +
                            fVar80 * fStack_2d0 + fVar322;
                pfVar5[3] = fVar78 * fVar354 + fVar74 * uStack_1f0._4_4_ + fVar87 * fStack_28c +
                            fVar70 * fStack_24c + fVar66 * fStack_2bc + fVar84 * fStack_25c +
                            fVar356 * fStack_1dc + fVar364 * fStack_29c +
                            fVar81 * fStack_2cc + fVar323;
                auVar324._0_4_ =
                     fVar75 * (float)local_1f8 + fVar71 * local_298 + fVar67 * local_2c8 +
                     fVar340 * local_268 + fVar342 * local_2a8 + fVar361 * local_2d8 + fVar320 +
                     fVar96 * fVar358 + fVar92 * local_258 + fVar88 * auVar273._0_4_;
                auVar324._4_4_ =
                     fVar76 * local_1f8._4_4_ + fVar72 * fStack_294 + fVar68 * fStack_2c4 +
                     fVar64 * fStack_264 + fVar353 * fStack_2a4 + fVar362 * fStack_2d4 + fVar321 +
                     fVar97 * fVar359 + fVar93 * fStack_254 + fVar89 * auVar273._4_4_;
                auVar324._8_4_ =
                     fVar77 * (float)uStack_1f0 + fVar73 * fStack_290 + fVar69 * fStack_2c0 +
                     fVar65 * fStack_260 + fVar355 * fStack_2a0 + fVar363 * fStack_2d0 + fVar322 +
                     fVar98 * fVar335 + fVar94 * fStack_250 + fVar90 * auVar273._8_4_;
                auVar324._12_4_ =
                     fVar78 * uStack_1f0._4_4_ + fVar74 * fStack_28c + fVar70 * fStack_2bc +
                     fVar66 * fStack_25c + fVar356 * fStack_29c + fVar364 * fStack_2cc + fVar323 +
                     fVar357 * fVar354 + fVar95 * fStack_24c + fVar91 * fStack_1dc;
                *(undefined1 (*) [16])(pauVar304[1] + lVar297) = auVar324;
                lVar297 = lVar297 + 0x20;
                pfVar317 = pfVar317 + 8;
                pfVar288 = pfVar288 + 8;
                pfVar310 = pfVar310 + 8;
              }
              pauVar304 = (undefined1 (*) [16])((long)*pauVar304 + lVar297);
              pfVar293 = pfVar317;
              for (; iVar312 < iVar281; iVar312 = iVar312 + 1) {
                auVar325._0_4_ =
                     *pfVar293 * fVar330 +
                     pfVar293[-4] * (float)local_1f8 + pfVar293[-8] * local_298 +
                     *pfVar288 * local_258 + pfVar288[-4] * local_2c8 + pfVar288[-8] * local_268 +
                     *pfVar310 * local_1e8 + pfVar310[-4] * local_2a8 +
                     pfVar310[-8] * local_2d8 + fVar320;
                auVar325._4_4_ =
                     pfVar293[1] * fVar343 +
                     pfVar293[-3] * local_1f8._4_4_ + pfVar293[-7] * fStack_294 +
                     pfVar288[1] * fStack_254 +
                     pfVar288[-3] * fStack_2c4 + pfVar288[-7] * fStack_264 +
                     pfVar310[1] * fStack_1e4 + pfVar310[-3] * fStack_2a4 +
                     pfVar310[-7] * fStack_2d4 + fVar321;
                auVar325._8_4_ =
                     pfVar293[2] * fVar335 +
                     pfVar293[-2] * (float)uStack_1f0 + pfVar293[-6] * fStack_290 +
                     pfVar288[2] * fStack_250 +
                     pfVar288[-2] * fStack_2c0 + pfVar288[-6] * fStack_260 +
                     pfVar310[2] * fStack_1e0 + pfVar310[-2] * fStack_2a0 +
                     pfVar310[-6] * fStack_2d0 + fVar322;
                auVar325._12_4_ =
                     pfVar293[3] * fVar354 +
                     pfVar293[-1] * uStack_1f0._4_4_ + pfVar293[-5] * fStack_28c +
                     pfVar288[3] * fStack_24c +
                     pfVar288[-1] * fStack_2bc + pfVar288[-5] * fStack_25c +
                     pfVar310[3] * fStack_1dc + pfVar310[-1] * fStack_29c +
                     pfVar310[-5] * fStack_2cc + fVar323;
                *pauVar304 = auVar325;
                pauVar304 = pauVar304 + 1;
                pfVar293 = pfVar293 + 4;
                pfVar288 = pfVar288 + 4;
                pfVar310 = pfVar310 + 4;
              }
              pfVar316 = pfVar288;
              pfVar315 = pfVar310;
            }
            local_1f8 = lVar299;
            uStack_1f0 = lVar291;
          }
        }
        else {
          iVar286 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var290) != 1) ||
               (*(int *)(&this->field_0xe0 + (long)p_Var290) != 1)) ||
              (*(int *)(&this->field_0xe4 + (long)p_Var290) != 2)) ||
             (*(int *)(&this->field_0xe8 + (long)p_Var290) != 2)) goto LAB_003d2126;
          iVar281 = top_blob->w;
          lVar300 = *(long *)(&this->field_0x1b0 + (long)p_Var290);
          uVar298 = 0;
          uVar314 = (ulong)(uint)top_blob->h;
          if (top_blob->h < 1) {
            uVar314 = uVar298;
          }
          uVar287 = (ulong)(uint)local_248.c;
          if (local_248.c < 1) {
            uVar287 = uVar298;
          }
          lVar299 = (long)((local_248.w - iVar281) * 8) * 4;
          for (; uVar298 != uVar287; uVar298 = uVar298 + 1) {
            if (lVar300 == 0) {
              fVar320 = 0.0;
              fVar321 = 0.0;
              fVar322 = 0.0;
              fVar323 = 0.0;
            }
            else {
              pfVar316 = (float *)(lVar300 + uVar298 * 0x10);
              fVar320 = *pfVar316;
              fVar321 = pfVar316[1];
              fVar322 = pfVar316[2];
              fVar323 = pfVar316[3];
            }
            pauVar304 = (undefined1 (*) [16])
                        (top_blob->cstep * uVar298 * top_blob->elemsize + (long)top_blob->data);
            pvVar57 = (this->weight_data_tm).data;
            lVar297 = (long)(this->weight_data_tm).w * uVar298 * (this->weight_data_tm).elemsize;
            piVar309 = (pointer)(local_248.cstep * uVar298 *
                                 CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                                (long)local_248.data);
            lVar291 = (long)local_248.w *
                      CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
            piVar311 = (pointer)((long)piVar309 + lVar291);
            pvVar292 = (void *)((long)piVar309 + lVar291 * 2);
            pfVar316 = (float *)((long)pvVar57 + lVar297);
            fVar330 = *pfVar316;
            fVar343 = pfVar316[1];
            fVar335 = pfVar316[2];
            fVar354 = pfVar316[3];
            pfVar316 = (float *)((long)pvVar57 + lVar297 + 0x10);
            fVar361 = *pfVar316;
            fVar362 = pfVar316[1];
            fVar363 = pfVar316[2];
            fVar364 = pfVar316[3];
            puVar1 = (undefined8 *)((long)pvVar57 + lVar297 + 0x20);
            uVar50 = *puVar1;
            uVar51 = puVar1[1];
            pfVar316 = (float *)((long)pvVar57 + lVar297 + 0x30);
            fVar342 = *pfVar316;
            fVar353 = pfVar316[1];
            fVar355 = pfVar316[2];
            fVar356 = pfVar316[3];
            pfVar316 = (float *)((long)pvVar57 + lVar297 + 0x40);
            fVar340 = *pfVar316;
            fVar64 = pfVar316[1];
            fVar65 = pfVar316[2];
            fVar66 = pfVar316[3];
            puVar1 = (undefined8 *)((long)pvVar57 + lVar297 + 0x50);
            uVar260 = *puVar1;
            uVar261 = puVar1[1];
            puVar1 = (undefined8 *)((long)pvVar57 + lVar297 + 0x60);
            uVar262 = *puVar1;
            uVar263 = puVar1[1];
            puVar1 = (undefined8 *)((long)pvVar57 + lVar297 + 0x70);
            uVar264 = *puVar1;
            uVar265 = puVar1[1];
            puVar1 = (undefined8 *)((long)pvVar57 + lVar297 + 0x80);
            uVar266 = *puVar1;
            uVar267 = puVar1[1];
            local_288 = (float)uVar50;
            fStack_284 = (float)((ulong)uVar50 >> 0x20);
            fStack_280 = (float)uVar51;
            fStack_27c = (float)((ulong)uVar51 >> 0x20);
            for (iVar306 = 0; iVar306 != (int)uVar314; iVar306 = iVar306 + 1) {
              lVar291 = 0;
              iVar312 = 0;
              while( true ) {
                local_268 = (float)uVar260;
                fStack_264 = (float)((ulong)uVar260 >> 0x20);
                fStack_260 = (float)uVar261;
                fStack_25c = (float)((ulong)uVar261 >> 0x20);
                local_258 = (float)uVar262;
                fStack_254 = (float)((ulong)uVar262 >> 0x20);
                fStack_250 = (float)uVar263;
                fStack_24c = (float)((ulong)uVar263 >> 0x20);
                fStack_2c4 = (float)((ulong)uVar264 >> 0x20);
                fStack_2bc = (float)((ulong)uVar265 >> 0x20);
                fStack_294 = (float)((ulong)uVar266 >> 0x20);
                fStack_28c = (float)((ulong)uVar267 >> 0x20);
                local_2c8 = (float)uVar264;
                fStack_2c0 = (float)uVar265;
                local_298 = (float)uVar266;
                fStack_290 = (float)uVar267;
                if (iVar281 <= iVar312 + 3) break;
                pfVar316 = (float *)((long)piVar309 + lVar291);
                fVar67 = pfVar316[1];
                fVar68 = pfVar316[2];
                fVar69 = pfVar316[3];
                pfVar317 = (float *)((long)piVar309 + lVar291 + 0x10);
                fVar70 = pfVar317[1];
                fVar71 = pfVar317[2];
                fVar72 = pfVar317[3];
                pfVar315 = (float *)((long)piVar309 + lVar291 + 0x20);
                fVar73 = *pfVar315;
                fVar74 = pfVar315[1];
                fVar75 = pfVar315[2];
                fVar76 = pfVar315[3];
                pfVar315 = (float *)((long)piVar309 + lVar291 + 0x40);
                fVar77 = *pfVar315;
                fVar78 = pfVar315[1];
                fVar79 = pfVar315[2];
                fVar80 = pfVar315[3];
                pfVar315 = (float *)((long)piVar311 + lVar291);
                fVar81 = pfVar315[1];
                fVar82 = pfVar315[2];
                fVar83 = pfVar315[3];
                pfVar288 = (float *)((long)piVar311 + lVar291 + 0x10);
                fVar84 = pfVar288[1];
                fVar85 = pfVar288[2];
                fVar86 = pfVar288[3];
                pfVar293 = (float *)((long)piVar311 + lVar291 + 0x20);
                fVar87 = *pfVar293;
                fVar88 = pfVar293[1];
                fVar89 = pfVar293[2];
                fVar90 = pfVar293[3];
                pfVar293 = (float *)((long)piVar311 + lVar291 + 0x40);
                fVar91 = *pfVar293;
                fVar92 = pfVar293[1];
                fVar93 = pfVar293[2];
                fVar94 = pfVar293[3];
                pfVar293 = (float *)((long)pvVar292 + lVar291);
                fVar95 = pfVar293[1];
                fVar96 = pfVar293[2];
                fVar97 = pfVar293[3];
                pfVar310 = (float *)((long)pvVar292 + lVar291 + 0x10);
                fVar98 = pfVar310[1];
                fVar357 = pfVar310[2];
                fVar358 = pfVar310[3];
                pfVar4 = (float *)((long)pvVar292 + lVar291 + 0x20);
                fVar359 = *pfVar4;
                fVar360 = pfVar4[1];
                fVar341 = pfVar4[2];
                fVar352 = pfVar4[3];
                pfVar4 = (float *)((long)pvVar292 + lVar291 + 0x40);
                fVar99 = *pfVar4;
                fVar100 = pfVar4[1];
                fVar101 = pfVar4[2];
                fVar102 = pfVar4[3];
                pfVar4 = (float *)((long)piVar309 + lVar291 + 0x30);
                fVar103 = *pfVar4;
                fVar104 = pfVar4[1];
                fVar105 = pfVar4[2];
                fVar106 = pfVar4[3];
                pfVar4 = (float *)((long)piVar311 + lVar291 + 0x30);
                fVar107 = *pfVar4;
                fVar108 = pfVar4[1];
                fVar109 = pfVar4[2];
                fVar110 = pfVar4[3];
                pfVar4 = (float *)((long)pvVar292 + lVar291 + 0x30);
                fVar111 = *pfVar4;
                fVar112 = pfVar4[1];
                fVar113 = pfVar4[2];
                fVar114 = pfVar4[3];
                *(float *)*pauVar304 =
                     fVar359 * local_298 + *pfVar310 * local_2c8 + *pfVar293 * local_258 +
                     fVar87 * local_268 + *pfVar288 * fVar340 + *pfVar315 * fVar342 +
                     fVar73 * local_288 + *pfVar317 * fVar361 + *pfVar316 * fVar330 + fVar320;
                *(float *)((long)*pauVar304 + 4) =
                     fVar360 * fStack_294 + fVar98 * fStack_2c4 + fVar95 * fStack_254 +
                     fVar88 * fStack_264 + fVar84 * fVar64 + fVar81 * fVar353 +
                     fVar74 * fStack_284 + fVar70 * fVar362 + fVar67 * fVar343 + fVar321;
                *(float *)((long)*pauVar304 + 8) =
                     fVar341 * fStack_290 + fVar357 * fStack_2c0 + fVar96 * fStack_250 +
                     fVar89 * fStack_260 + fVar85 * fVar65 + fVar82 * fVar355 +
                     fVar75 * fStack_280 + fVar71 * fVar363 + fVar68 * fVar335 + fVar322;
                *(float *)((long)*pauVar304 + 0xc) =
                     fVar352 * fStack_28c + fVar358 * fStack_2bc + fVar97 * fStack_24c +
                     fVar90 * fStack_25c + fVar86 * fVar66 + fVar83 * fVar356 +
                     fVar76 * fStack_27c + fVar72 * fVar364 + fVar69 * fVar354 + fVar323;
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x60);
                fVar67 = *pfVar316;
                fVar68 = pfVar316[1];
                fVar69 = pfVar316[2];
                fVar70 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x60);
                fVar71 = *pfVar316;
                fVar72 = pfVar316[1];
                fVar81 = pfVar316[2];
                fVar82 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x60);
                fVar83 = *pfVar316;
                fVar84 = pfVar316[1];
                fVar85 = pfVar316[2];
                fVar86 = pfVar316[3];
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x50);
                fVar95 = *pfVar316;
                fVar96 = pfVar316[1];
                fVar97 = pfVar316[2];
                fVar98 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x50);
                fVar357 = *pfVar316;
                fVar358 = pfVar316[1];
                fVar115 = pfVar316[2];
                fVar116 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x50);
                fVar117 = *pfVar316;
                fVar118 = pfVar316[1];
                fVar119 = pfVar316[2];
                fVar120 = pfVar316[3];
                *(float *)pauVar304[1] =
                     fVar99 * local_298 + fVar91 * local_268 + fVar77 * local_288 +
                     fVar359 * local_258 + fVar87 * fVar342 + fVar73 * fVar330 + fVar320 +
                     fVar111 * local_2c8 + fVar107 * fVar340 + fVar103 * fVar361;
                *(float *)(pauVar304[1] + 4) =
                     fVar100 * fStack_294 + fVar92 * fStack_264 + fVar78 * fStack_284 +
                     fVar360 * fStack_254 + fVar88 * fVar353 + fVar74 * fVar343 + fVar321 +
                     fVar112 * fStack_2c4 + fVar108 * fVar64 + fVar104 * fVar362;
                *(float *)(pauVar304[1] + 8) =
                     fVar101 * fStack_290 + fVar93 * fStack_260 + fVar79 * fStack_280 +
                     fVar341 * fStack_250 + fVar89 * fVar355 + fVar75 * fVar335 + fVar322 +
                     fVar113 * fStack_2c0 + fVar109 * fVar65 + fVar105 * fVar363;
                *(float *)(pauVar304[1] + 0xc) =
                     fVar102 * fStack_28c + fVar94 * fStack_25c + fVar80 * fStack_27c +
                     fVar352 * fStack_24c + fVar90 * fVar356 + fVar76 * fVar354 + fVar323 +
                     fVar114 * fStack_2bc + fVar110 * fVar66 + fVar106 * fVar364;
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x70);
                fVar73 = *pfVar316;
                fVar74 = pfVar316[1];
                fVar75 = pfVar316[2];
                fVar76 = pfVar316[3];
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x80);
                fVar87 = *pfVar316;
                fVar88 = pfVar316[1];
                fVar89 = pfVar316[2];
                fVar90 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x70);
                fVar359 = *pfVar316;
                fVar360 = pfVar316[1];
                fVar341 = pfVar316[2];
                fVar352 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x80);
                fVar103 = *pfVar316;
                fVar104 = pfVar316[1];
                fVar105 = pfVar316[2];
                fVar106 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x70);
                fVar107 = *pfVar316;
                fVar108 = pfVar316[1];
                fVar109 = pfVar316[2];
                fVar110 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x80);
                fVar111 = *pfVar316;
                fVar112 = pfVar316[1];
                fVar113 = pfVar316[2];
                fVar114 = pfVar316[3];
                *(float *)pauVar304[2] =
                     fVar83 * local_298 + fVar71 * local_268 + fVar67 * local_288 +
                     fVar99 * local_258 + fVar91 * fVar342 + fVar77 * fVar330 + fVar320 +
                     fVar117 * local_2c8 + fVar357 * fVar340 + fVar95 * fVar361;
                *(float *)(pauVar304[2] + 4) =
                     fVar84 * fStack_294 + fVar72 * fStack_264 + fVar68 * fStack_284 +
                     fVar100 * fStack_254 + fVar92 * fVar353 + fVar78 * fVar343 + fVar321 +
                     fVar118 * fStack_2c4 + fVar358 * fVar64 + fVar96 * fVar362;
                *(float *)(pauVar304[2] + 8) =
                     fVar85 * fStack_290 + fVar81 * fStack_260 + fVar69 * fStack_280 +
                     fVar101 * fStack_250 + fVar93 * fVar355 + fVar79 * fVar335 + fVar322 +
                     fVar119 * fStack_2c0 + fVar115 * fVar65 + fVar97 * fVar363;
                *(float *)(pauVar304[2] + 0xc) =
                     fVar86 * fStack_28c + fVar82 * fStack_25c + fVar70 * fStack_27c +
                     fVar102 * fStack_24c + fVar94 * fVar356 + fVar80 * fVar354 + fVar323 +
                     fVar120 * fStack_2bc + fVar116 * fVar66 + fVar98 * fVar364;
                *(float *)pauVar304[3] =
                     fVar83 * local_258 + fVar71 * fVar342 + fVar67 * fVar330 + fVar320 +
                     fVar107 * local_2c8 + fVar359 * fVar340 + fVar73 * fVar361 +
                     fVar111 * local_298 + fVar103 * local_268 + fVar87 * local_288;
                *(float *)(pauVar304[3] + 4) =
                     fVar84 * fStack_254 + fVar72 * fVar353 + fVar68 * fVar343 + fVar321 +
                     fVar108 * fStack_2c4 + fVar360 * fVar64 + fVar74 * fVar362 +
                     fVar112 * fStack_294 + fVar104 * fStack_264 + fVar88 * fStack_284;
                *(float *)(pauVar304[3] + 8) =
                     fVar85 * fStack_250 + fVar81 * fVar355 + fVar69 * fVar335 + fVar322 +
                     fVar109 * fStack_2c0 + fVar341 * fVar65 + fVar75 * fVar363 +
                     fVar113 * fStack_290 + fVar105 * fStack_260 + fVar89 * fStack_280;
                *(float *)(pauVar304[3] + 0xc) =
                     fVar86 * fStack_24c + fVar82 * fVar356 + fVar70 * fVar354 + fVar323 +
                     fVar110 * fStack_2bc + fVar352 * fVar66 + fVar76 * fVar364 +
                     fVar114 * fStack_28c + fVar106 * fStack_25c + fVar90 * fStack_27c;
                pauVar304 = pauVar304 + 4;
                iVar312 = iVar312 + 4;
                lVar291 = lVar291 + 0x80;
              }
              for (; iVar312 + 1 < iVar281; iVar312 = iVar312 + 2) {
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x20);
                fVar67 = *pfVar316;
                fVar68 = pfVar316[1];
                fVar69 = pfVar316[2];
                fVar70 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x20);
                fVar71 = *pfVar316;
                fVar72 = pfVar316[1];
                fVar73 = pfVar316[2];
                fVar74 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x20);
                fVar75 = *pfVar316;
                fVar76 = pfVar316[1];
                fVar77 = pfVar316[2];
                fVar78 = pfVar316[3];
                pfVar316 = (float *)((long)piVar309 + lVar291);
                pfVar317 = (float *)((long)piVar309 + lVar291 + 0x10);
                pfVar315 = (float *)((long)piVar311 + lVar291);
                pfVar288 = (float *)((long)piVar311 + lVar291 + 0x10);
                pfVar293 = (float *)((long)pvVar292 + lVar291);
                pfVar310 = (float *)((long)pvVar292 + lVar291 + 0x10);
                auVar350._0_4_ =
                     fVar75 * local_298 + *pfVar310 * local_2c8 + *pfVar293 * local_258 +
                     fVar71 * local_268 + *pfVar288 * fVar340 + *pfVar315 * fVar342 +
                     fVar67 * local_288 + *pfVar317 * fVar361 + *pfVar316 * fVar330 + fVar320;
                auVar350._4_4_ =
                     fVar76 * fStack_294 + pfVar310[1] * fStack_2c4 + pfVar293[1] * fStack_254 +
                     fVar72 * fStack_264 + pfVar288[1] * fVar64 + pfVar315[1] * fVar353 +
                     fVar68 * fStack_284 + pfVar317[1] * fVar362 + pfVar316[1] * fVar343 + fVar321;
                auVar350._8_4_ =
                     fVar77 * fStack_290 + pfVar310[2] * fStack_2c0 + pfVar293[2] * fStack_250 +
                     fVar73 * fStack_260 + pfVar288[2] * fVar65 + pfVar315[2] * fVar355 +
                     fVar69 * fStack_280 + pfVar317[2] * fVar363 + pfVar316[2] * fVar335 + fVar322;
                auVar350._12_4_ =
                     fVar78 * fStack_28c + pfVar310[3] * fStack_2bc + pfVar293[3] * fStack_24c +
                     fVar74 * fStack_25c + pfVar288[3] * fVar66 + pfVar315[3] * fVar356 +
                     fVar70 * fStack_27c + pfVar317[3] * fVar364 + pfVar316[3] * fVar354 + fVar323;
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x30);
                fVar79 = *pfVar316;
                fVar80 = pfVar316[1];
                fVar81 = pfVar316[2];
                fVar82 = pfVar316[3];
                pfVar316 = (float *)((long)piVar309 + lVar291 + 0x40);
                fVar83 = *pfVar316;
                fVar84 = pfVar316[1];
                fVar85 = pfVar316[2];
                fVar86 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x30);
                fVar87 = *pfVar316;
                fVar88 = pfVar316[1];
                fVar89 = pfVar316[2];
                fVar90 = pfVar316[3];
                pfVar316 = (float *)((long)piVar311 + lVar291 + 0x40);
                fVar91 = *pfVar316;
                fVar92 = pfVar316[1];
                fVar93 = pfVar316[2];
                fVar94 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x30);
                fVar95 = *pfVar316;
                fVar96 = pfVar316[1];
                fVar97 = pfVar316[2];
                fVar98 = pfVar316[3];
                pfVar316 = (float *)((long)pvVar292 + lVar291 + 0x40);
                fVar357 = *pfVar316;
                fVar358 = pfVar316[1];
                fVar359 = pfVar316[2];
                fVar360 = pfVar316[3];
                *pauVar304 = auVar350;
                *(float *)pauVar304[1] =
                     fVar75 * local_258 + fVar71 * fVar342 + fVar67 * fVar330 + fVar320 +
                     fVar95 * local_2c8 + fVar87 * fVar340 + fVar79 * fVar361 +
                     fVar357 * local_298 + fVar91 * local_268 + fVar83 * local_288;
                *(float *)(pauVar304[1] + 4) =
                     fVar76 * fStack_254 + fVar72 * fVar353 + fVar68 * fVar343 + fVar321 +
                     fVar96 * fStack_2c4 + fVar88 * fVar64 + fVar80 * fVar362 +
                     fVar358 * fStack_294 + fVar92 * fStack_264 + fVar84 * fStack_284;
                *(float *)(pauVar304[1] + 8) =
                     fVar77 * fStack_250 + fVar73 * fVar355 + fVar69 * fVar335 + fVar322 +
                     fVar97 * fStack_2c0 + fVar89 * fVar65 + fVar81 * fVar363 +
                     fVar359 * fStack_290 + fVar93 * fStack_260 + fVar85 * fStack_280;
                *(float *)(pauVar304[1] + 0xc) =
                     fVar78 * fStack_24c + fVar74 * fVar356 + fVar70 * fVar354 + fVar323 +
                     fVar98 * fStack_2bc + fVar90 * fVar66 + fVar82 * fVar364 +
                     fVar360 * fStack_28c + fVar94 * fStack_25c + fVar86 * fStack_27c;
                pauVar304 = pauVar304 + 2;
                lVar291 = lVar291 + 0x40;
              }
              for (; iVar312 < iVar281; iVar312 = iVar312 + 1) {
                pfVar316 = (float *)((long)piVar309 + lVar291);
                pfVar317 = (float *)((long)piVar309 + lVar291 + 0x10);
                pfVar288 = (float *)((long)piVar309 + lVar291 + 0x20);
                pfVar315 = (float *)((long)piVar311 + lVar291);
                pfVar310 = (float *)((long)piVar311 + lVar291 + 0x10);
                pfVar4 = (float *)((long)piVar311 + lVar291 + 0x20);
                pfVar293 = (float *)((long)pvVar292 + lVar291);
                pfVar5 = (float *)((long)pvVar292 + lVar291 + 0x10);
                pfVar27 = (float *)((long)pvVar292 + lVar291 + 0x20);
                auVar326._0_4_ =
                     *pfVar27 * local_298 + *pfVar5 * local_2c8 + *pfVar293 * local_258 +
                     *pfVar4 * local_268 + *pfVar310 * fVar340 + *pfVar315 * fVar342 +
                     *pfVar288 * local_288 + *pfVar317 * fVar361 + *pfVar316 * fVar330 + fVar320;
                auVar326._4_4_ =
                     pfVar27[1] * fStack_294 + pfVar5[1] * fStack_2c4 + pfVar293[1] * fStack_254 +
                     pfVar4[1] * fStack_264 + pfVar310[1] * fVar64 + pfVar315[1] * fVar353 +
                     pfVar288[1] * fStack_284 + pfVar317[1] * fVar362 +
                     pfVar316[1] * fVar343 + fVar321;
                auVar326._8_4_ =
                     pfVar27[2] * fStack_290 + pfVar5[2] * fStack_2c0 + pfVar293[2] * fStack_250 +
                     pfVar4[2] * fStack_260 + pfVar310[2] * fVar65 + pfVar315[2] * fVar355 +
                     pfVar288[2] * fStack_280 + pfVar317[2] * fVar363 +
                     pfVar316[2] * fVar335 + fVar322;
                auVar326._12_4_ =
                     pfVar27[3] * fStack_28c + pfVar5[3] * fStack_2bc + pfVar293[3] * fStack_24c +
                     pfVar4[3] * fStack_25c + pfVar310[3] * fVar66 + pfVar315[3] * fVar356 +
                     pfVar288[3] * fStack_27c + pfVar317[3] * fVar364 +
                     pfVar316[3] * fVar354 + fVar323;
                *pauVar304 = auVar326;
                pauVar304 = pauVar304 + 1;
                lVar291 = lVar291 + 0x20;
              }
              piVar309 = (pointer)((long)piVar309 + lVar291 + lVar299);
              piVar311 = (pointer)((long)piVar311 + lVar291 + lVar299);
              pvVar292 = (void *)((long)pvVar292 + lVar291 + lVar299);
            }
          }
        }
LAB_003d284b:
        pLVar301 = this->activation;
        goto LAB_003d285d;
      }
LAB_003d2126:
      uVar303 = iVar286 * iVar281;
      std::vector<int,_std::allocator<int>_>::vector
                (&_space_ofs,(long)(int)uVar303,(allocator_type *)&opt_p);
      pp_Var58 = this->_vptr_ConvolutionDepthWise_x86;
      p_Var290 = pp_Var58[-3];
      iVar281 = *(int *)(&this->field_0xe0 + (long)p_Var290);
      iVar286 = *(int *)(&this->field_0xdc + (long)p_Var290);
      iVar52 = *(int *)(&this->field_0xd4 + (long)p_Var290);
      iVar296 = 0;
      lVar300 = 0;
      for (iVar302 = 0; auVar344 = _DAT_004c6c90, auVar345 = _DAT_004c6c50,
          iVar302 < *(int *)(&this->field_0xd8 + (long)p_Var290); iVar302 = iVar302 + 1) {
        for (lVar299 = 0; (int)lVar299 < *(int *)(&this->field_0xd4 + (long)p_Var290);
            lVar299 = lVar299 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar300 + lVar299] = iVar296;
          p_Var290 = pp_Var58[-3];
          iVar296 = iVar296 + *(int *)(&this->field_0xdc + (long)p_Var290);
        }
        iVar296 = iVar296 + (iVar277 * iVar281 - iVar286 * iVar52);
        lVar300 = (int)lVar300 + lVar299;
      }
      iVar281 = 0;
      uVar283 = uVar303;
      if ((int)uVar303 < 1) {
        uVar283 = 0;
      }
      if ((int)uVar295 < 1) {
        uVar298 = 0;
      }
      uVar336 = 0xc2b0c0a5;
      uVar337 = 0xc2b0c0a5;
      uVar338 = 0xc2b0c0a5;
      uVar339 = 0xc2b0c0a5;
      fVar320 = (float)DAT_004c6c90;
      fVar321 = DAT_004c6c90._4_4_;
      fVar322 = DAT_004c6c90._8_4_;
      fVar323 = DAT_004c6c90._12_4_;
      for (uVar314 = 0; uVar314 != uVar298; uVar314 = uVar314 + 1) {
        pvVar292 = (void *)(top_blob->cstep * uVar314 * top_blob->elemsize + (long)top_blob->data);
        pvVar57 = (this->weight_data_tm).data;
        for (iVar286 = 0; iVar286 <= iVar312; iVar286 = iVar286 + 1) {
          pp_Var58 = this->_vptr_ConvolutionDepthWise_x86;
          for (lVar300 = 0; lVar300 <= iVar306; lVar300 = lVar300 + 1) {
            p_Var290 = pp_Var58[-3];
            if (*(int *)(&this->field_0x100 + (long)p_Var290) == 0) {
              auVar327 = ZEXT816(0);
            }
            else {
              auVar327 = *(undefined1 (*) [16])
                          (*(long *)(&this->field_0x1b0 + (long)p_Var290) + uVar314 * 0x10);
            }
            lVar299 = 0;
            while( true ) {
              fVar330 = auVar327._0_4_;
              fVar343 = auVar327._4_4_;
              fVar335 = auVar327._8_4_;
              fVar354 = auVar327._12_4_;
              if ((ulong)uVar283 * 4 == lVar299) break;
              auVar350 = *(undefined1 (*) [16])
                          ((long)local_248.data +
                          (long)*(int *)((long)_space_ofs.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + lVar299) * 0x10 +
                          (long)(*(int *)(&this->field_0xe4 + (long)p_Var290) * (int)lVar300 * 4) *
                          4 + (long)iVar286 * (long)*(int *)(&this->field_0xe8 + (long)p_Var290) *
                              (long)local_248.w *
                              CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize) +
                              local_248.cstep * uVar314 *
                              CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize));
              pfVar316 = (float *)((long)pvVar57 + lVar299 * 4 + (long)iVar281 * 4);
              auVar327._0_4_ = fVar330 + *pfVar316 * auVar350._0_4_;
              auVar327._4_4_ = fVar343 + pfVar316[1] * auVar350._4_4_;
              auVar327._8_4_ = fVar335 + pfVar316[2] * auVar350._8_4_;
              auVar327._12_4_ = fVar354 + pfVar316[3] * auVar350._12_4_;
              lVar299 = lVar299 + 4;
            }
            auVar346 = auVar327;
            if (5 < *(int *)(&this->field_0x110 + (long)p_Var290) - 1U)
            goto switchD_003d2375_caseD_1;
            auVar346 = maxps(auVar327,ZEXT816(0));
            switch(*(int *)(&this->field_0x110 + (long)p_Var290)) {
            case 2:
              auVar350 = minps(auVar327,ZEXT816(0));
              fVar330 = **(float **)(&this->field_0x118 + (long)p_Var290);
              auVar347._0_4_ = auVar346._0_4_ + fVar330 * auVar350._0_4_;
              auVar347._4_4_ = auVar346._4_4_ + fVar330 * auVar350._4_4_;
              auVar347._8_4_ = auVar346._8_4_ + fVar330 * auVar350._8_4_;
              auVar347._12_4_ = auVar346._12_4_ + fVar330 * auVar350._12_4_;
              auVar346 = auVar347;
              break;
            case 3:
              uVar48 = **(undefined4 **)(&this->field_0x118 + (long)p_Var290);
              uVar49 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var290))[1];
              auVar334._4_4_ = uVar48;
              auVar334._0_4_ = uVar48;
              auVar334._8_4_ = uVar48;
              auVar334._12_4_ = uVar48;
              auVar348._4_4_ = uVar49;
              auVar348._0_4_ = uVar49;
              auVar348._8_4_ = uVar49;
              auVar348._12_4_ = uVar49;
              auVar350 = maxps(auVar327,auVar334);
              auVar346 = minps(auVar350,auVar348);
              break;
            case 4:
              auVar328._0_8_ = auVar327._0_8_ ^ 0x8000000080000000;
              auVar328._8_4_ = -fVar335;
              auVar328._12_4_ = -fVar354;
              auVar350 = minps(auVar328,auVar345);
              auVar61._4_4_ = uVar337;
              auVar61._0_4_ = uVar336;
              auVar61._8_4_ = uVar338;
              auVar61._12_4_ = uVar339;
              auVar350 = maxps(auVar350,auVar61);
              fVar343 = auVar350._0_4_ * 1.442695 + 0.5;
              fVar354 = auVar350._4_4_ * 1.442695 + 0.5;
              fVar362 = auVar350._8_4_ * 1.442695 + 0.5;
              fVar364 = auVar350._12_4_ * 1.442695 + 0.5;
              fVar330 = (float)(int)fVar343;
              fVar335 = (float)(int)fVar354;
              fVar361 = (float)(int)fVar362;
              fVar363 = (float)(int)fVar364;
              fVar330 = fVar330 - (float)(-(uint)(fVar343 < fVar330) & (uint)fVar320);
              fVar335 = fVar335 - (float)(-(uint)(fVar354 < fVar335) & (uint)fVar321);
              fVar361 = fVar361 - (float)(-(uint)(fVar362 < fVar361) & (uint)fVar322);
              fVar363 = fVar363 - (float)(-(uint)(fVar364 < fVar363) & (uint)fVar323);
              fVar343 = fVar330 * -0.6931472 + auVar350._0_4_;
              fVar354 = fVar335 * -0.6931472 + auVar350._4_4_;
              fVar362 = fVar361 * -0.6931472 + auVar350._8_4_;
              fVar364 = fVar363 * -0.6931472 + auVar350._12_4_;
              auVar329._0_4_ = fVar343 * fVar343;
              auVar329._4_4_ = fVar354 * fVar354;
              auVar329._8_4_ = fVar362 * fVar362;
              auVar329._12_4_ = fVar364 * fVar364;
              fVar342 = (float)((int)fVar330 * 0x800000 + (int)fVar320) *
                        (fVar343 + fVar320 +
                        (((((fVar343 * 0.00019875691 + 0.0013981999) * fVar343 + 0.008333452) *
                           fVar343 + 0.041665796) * fVar343 + 0.16666666) * fVar343 + 0.5) *
                        auVar329._0_4_) + fVar320;
              fVar353 = (float)((int)fVar335 * 0x800000 + (int)fVar321) *
                        (fVar354 + fVar321 +
                        (((((fVar354 * 0.00019875691 + 0.0013981999) * fVar354 + 0.008333452) *
                           fVar354 + 0.041665796) * fVar354 + 0.16666666) * fVar354 + 0.5) *
                        auVar329._4_4_) + fVar321;
              fVar361 = (float)((int)fVar361 * 0x800000 + (int)fVar322) *
                        (fVar362 + fVar322 +
                        (((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 + 0.008333452) *
                           fVar362 + 0.041665796) * fVar362 + 0.16666666) * fVar362 + 0.5) *
                        auVar329._8_4_) + fVar322;
              fVar362 = (float)((int)fVar363 * 0x800000 + (int)fVar323) *
                        (fVar364 + fVar323 +
                        (((((fVar364 * 0.00019875691 + 0.0013981999) * fVar364 + 0.008333452) *
                           fVar364 + 0.041665796) * fVar364 + 0.16666666) * fVar364 + 0.5) *
                        auVar329._12_4_) + fVar323;
              auVar63._4_4_ = fVar353;
              auVar63._0_4_ = fVar342;
              auVar63._8_4_ = fVar361;
              auVar63._12_4_ = fVar362;
              auVar350 = rcpps(auVar329,auVar63);
              fVar330 = auVar350._0_4_;
              fVar343 = auVar350._4_4_;
              fVar335 = auVar350._8_4_;
              fVar354 = auVar350._12_4_;
              auVar346._0_4_ = (fVar320 - fVar342 * fVar330) * fVar330 + fVar330;
              auVar346._4_4_ = (fVar321 - fVar353 * fVar343) * fVar343 + fVar343;
              auVar346._8_4_ = (fVar322 - fVar361 * fVar335) * fVar335 + fVar335;
              auVar346._12_4_ = (fVar323 - fVar362 * fVar354) * fVar354 + fVar354;
              break;
            case 5:
              auVar350 = minps(auVar327,auVar345);
              auVar60._4_4_ = uVar337;
              auVar60._0_4_ = uVar336;
              auVar60._8_4_ = uVar338;
              auVar60._12_4_ = uVar339;
              auVar350 = maxps(auVar350,auVar60);
              fVar361 = auVar350._0_4_ * 1.442695 + 0.5;
              fVar362 = auVar350._4_4_ * 1.442695 + 0.5;
              fVar363 = auVar350._8_4_ * 1.442695 + 0.5;
              fVar364 = auVar350._12_4_ * 1.442695 + 0.5;
              fVar342 = (float)(int)fVar361;
              fVar353 = (float)(int)fVar362;
              fVar355 = (float)(int)fVar363;
              fVar356 = (float)(int)fVar364;
              fVar342 = fVar342 - (float)(-(uint)(fVar361 < fVar342) & (uint)fVar320);
              fVar353 = fVar353 - (float)(-(uint)(fVar362 < fVar353) & (uint)fVar321);
              fVar355 = fVar355 - (float)(-(uint)(fVar363 < fVar355) & (uint)fVar322);
              fVar356 = fVar356 - (float)(-(uint)(fVar364 < fVar356) & (uint)fVar323);
              fVar361 = auVar350._0_4_ - fVar342 * 0.6931472;
              fVar362 = auVar350._4_4_ - fVar353 * 0.6931472;
              fVar363 = auVar350._8_4_ - fVar355 * 0.6931472;
              fVar364 = auVar350._12_4_ - fVar356 * 0.6931472;
              auVar365._0_4_ =
                   (float)((int)fVar342 * 0x800000 + (int)fVar320) *
                   (fVar361 + fVar320 +
                   (((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 + 0.008333452) * fVar361 +
                     0.041665796) * fVar361 + 0.16666666) * fVar361 + 0.5) * fVar361 * fVar361) +
                   fVar320;
              auVar365._4_4_ =
                   (float)((int)fVar353 * 0x800000 + (int)fVar321) *
                   (fVar362 + fVar321 +
                   (((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 + 0.008333452) * fVar362 +
                     0.041665796) * fVar362 + 0.16666666) * fVar362 + 0.5) * fVar362 * fVar362) +
                   fVar321;
              auVar365._8_4_ =
                   (float)((int)fVar355 * 0x800000 + (int)fVar322) *
                   (fVar363 + fVar322 +
                   (((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 + 0.008333452) * fVar363 +
                     0.041665796) * fVar363 + 0.16666666) * fVar363 + 0.5) * fVar363 * fVar363) +
                   fVar322;
              auVar365._12_4_ =
                   (float)((int)fVar356 * 0x800000 + (int)fVar323) *
                   (fVar364 + fVar323 +
                   (((((fVar364 * 0.00019875691 + 0.0013981999) * fVar364 + 0.008333452) * fVar364 +
                     0.041665796) * fVar364 + 0.16666666) * fVar364 + 0.5) * fVar364 * fVar364) +
                   fVar323;
              auVar350 = maxps(auVar365,_DAT_004c6d00);
              fVar361 = (float)(auVar350._0_4_ & 0x807fffff | 0x3f000000);
              fVar363 = (float)(auVar350._4_4_ & 0x807fffff | 0x3f000000);
              fVar342 = (float)(auVar350._8_4_ & 0x807fffff | 0x3f000000);
              fVar355 = (float)(auVar350._12_4_ & 0x807fffff | 0x3f000000);
              fVar362 = fVar361 + -1.0 + (float)(-(uint)(fVar361 < 0.70710677) & (uint)fVar361);
              fVar364 = fVar363 + -1.0 + (float)(-(uint)(fVar363 < 0.70710677) & (uint)fVar363);
              fVar353 = fVar342 + -1.0 + (float)(-(uint)(fVar342 < 0.70710677) & (uint)fVar342);
              fVar356 = fVar355 + -1.0 + (float)(-(uint)(fVar355 < 0.70710677) & (uint)fVar355);
              uVar336 = (undefined4)DAT_004c6c60;
              uVar337 = DAT_004c6c60._4_4_;
              uVar338 = DAT_004c6c60._8_4_;
              uVar339 = DAT_004c6c60._12_4_;
              auVar332._0_8_ =
                   CONCAT44(-(uint)(auVar365._4_4_ <= 0.0),-(uint)(auVar365._0_4_ <= 0.0)) &
                   0x7fffffff7fffffff;
              auVar332._8_4_ = -(uint)(auVar365._8_4_ <= 0.0) & 0x7fffffff;
              auVar332._12_4_ = -(uint)(auVar365._12_4_ <= 0.0) & 0x7fffffff;
              auVar59._4_4_ =
                   ~-(uint)(auVar365._4_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar350._4_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar363 < 0.70710677) & (uint)fVar321)) * 0.6931472 +
                           fVar364 +
                          (((((((((fVar364 * 0.070376836 + -0.1151461) * fVar364 + 0.116769984) *
                                 fVar364 + -0.12420141) * fVar364 + 0.14249323) * fVar364 +
                              -0.16668057) * fVar364 + 0.20000714) * fVar364 + -0.24999994) *
                            fVar364 + 0.3333333) * fVar364 + -0.5) * fVar364 * fVar364) * -2.0);
              auVar59._0_4_ =
                   ~-(uint)(auVar365._0_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar350._0_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar361 < 0.70710677) & (uint)fVar320)) * 0.6931472 +
                           fVar362 +
                          (((((((((fVar362 * 0.070376836 + -0.1151461) * fVar362 + 0.116769984) *
                                 fVar362 + -0.12420141) * fVar362 + 0.14249323) * fVar362 +
                              -0.16668057) * fVar362 + 0.20000714) * fVar362 + -0.24999994) *
                            fVar362 + 0.3333333) * fVar362 + -0.5) * fVar362 * fVar362) * -2.0);
              auVar59._8_4_ =
                   ~-(uint)(auVar365._8_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar350._8_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar342 < 0.70710677) & (uint)fVar322)) * 0.6931472 +
                           fVar353 +
                          (((((((((fVar353 * 0.070376836 + -0.1151461) * fVar353 + 0.116769984) *
                                 fVar353 + -0.12420141) * fVar353 + 0.14249323) * fVar353 +
                              -0.16668057) * fVar353 + 0.20000714) * fVar353 + -0.24999994) *
                            fVar353 + 0.3333333) * fVar353 + -0.5) * fVar353 * fVar353) * -2.0);
              auVar59._12_4_ =
                   ~-(uint)(auVar365._12_4_ <= 0.0) &
                   (uint)((((float)(int)((auVar350._12_4_ >> 0x17) - 0x7e) -
                           (float)(-(uint)(fVar355 < 0.70710677) & (uint)fVar323)) * 0.6931472 +
                           fVar356 +
                          (((((((((fVar356 * 0.070376836 + -0.1151461) * fVar356 + 0.116769984) *
                                 fVar356 + -0.12420141) * fVar356 + 0.14249323) * fVar356 +
                              -0.16668057) * fVar356 + 0.20000714) * fVar356 + -0.24999994) *
                            fVar356 + 0.3333333) * fVar356 + -0.5) * fVar356 * fVar356) * -2.0);
              auVar350 = minps(auVar332 | auVar59,auVar345);
              auVar350 = maxps(auVar350,_DAT_004c6c60);
              fVar361 = auVar350._0_4_ * 1.442695 + 0.5;
              fVar362 = auVar350._4_4_ * 1.442695 + 0.5;
              fVar363 = auVar350._8_4_ * 1.442695 + 0.5;
              fVar364 = auVar350._12_4_ * 1.442695 + 0.5;
              fVar342 = (float)(int)fVar361;
              fVar353 = (float)(int)fVar362;
              fVar355 = (float)(int)fVar363;
              fVar356 = (float)(int)fVar364;
              fVar342 = fVar342 - (float)(-(uint)(fVar361 < fVar342) & (uint)fVar320);
              fVar353 = fVar353 - (float)(-(uint)(fVar362 < fVar353) & (uint)fVar321);
              fVar355 = fVar355 - (float)(-(uint)(fVar363 < fVar355) & (uint)fVar322);
              fVar356 = fVar356 - (float)(-(uint)(fVar364 < fVar356) & (uint)fVar323);
              fVar361 = auVar350._0_4_ - fVar342 * 0.6931472;
              fVar362 = auVar350._4_4_ - fVar353 * 0.6931472;
              fVar363 = auVar350._8_4_ - fVar355 * 0.6931472;
              fVar364 = auVar350._12_4_ - fVar356 * 0.6931472;
              auVar333._0_4_ =
                   fVar361 + fVar320 +
                   (((((fVar361 * 0.00019875691 + 0.0013981999) * fVar361 + 0.008333452) * fVar361 +
                     0.041665796) * fVar361 + 0.16666666) * fVar361 + 0.5) * fVar361 * fVar361;
              auVar333._4_4_ =
                   fVar362 + fVar321 +
                   (((((fVar362 * 0.00019875691 + 0.0013981999) * fVar362 + 0.008333452) * fVar362 +
                     0.041665796) * fVar362 + 0.16666666) * fVar362 + 0.5) * fVar362 * fVar362;
              auVar333._8_4_ =
                   fVar363 + fVar322 +
                   (((((fVar363 * 0.00019875691 + 0.0013981999) * fVar363 + 0.008333452) * fVar363 +
                     0.041665796) * fVar363 + 0.16666666) * fVar363 + 0.5) * fVar363 * fVar363;
              auVar333._12_4_ =
                   fVar364 + fVar323 +
                   (((((fVar364 * 0.00019875691 + 0.0013981999) * fVar364 + 0.008333452) * fVar364 +
                     0.041665796) * fVar364 + 0.16666666) * fVar364 + 0.5) * fVar364 * fVar364;
              fVar342 = (float)((int)fVar342 * 0x800000 + (int)fVar320) * auVar333._0_4_ + fVar320;
              fVar353 = (float)((int)fVar353 * 0x800000 + (int)fVar321) * auVar333._4_4_ + fVar321;
              fVar355 = (float)((int)fVar355 * 0x800000 + (int)fVar322) * auVar333._8_4_ + fVar322;
              fVar356 = (float)((int)fVar356 * 0x800000 + (int)fVar323) * auVar333._12_4_ + fVar323;
              auVar62._4_4_ = fVar353;
              auVar62._0_4_ = fVar342;
              auVar62._8_4_ = fVar355;
              auVar62._12_4_ = fVar356;
              auVar350 = rcpps(auVar333,auVar62);
              fVar361 = auVar350._0_4_;
              fVar362 = auVar350._4_4_;
              fVar363 = auVar350._8_4_;
              fVar364 = auVar350._12_4_;
              auVar351._0_4_ =
                   fVar361 + fVar361 + -1.0 + (2.0 - fVar342 * (fVar361 + fVar361)) * fVar361;
              auVar351._4_4_ =
                   fVar362 + fVar362 + -1.0 + (2.0 - fVar353 * (fVar362 + fVar362)) * fVar362;
              auVar351._8_4_ =
                   fVar363 + fVar363 + -1.0 + (2.0 - fVar355 * (fVar363 + fVar363)) * fVar363;
              auVar351._12_4_ =
                   fVar364 + fVar364 + -1.0 + (2.0 - fVar356 * (fVar364 + fVar364)) * fVar364;
              goto LAB_003d26d8;
            case 6:
              fVar361 = **(float **)(&this->field_0x118 + (long)p_Var290);
              fVar362 = (*(float **)(&this->field_0x118 + (long)p_Var290))[1];
              auVar349._0_4_ = fVar361 * fVar330 + fVar362;
              auVar349._4_4_ = fVar361 * fVar343 + fVar362;
              auVar349._8_4_ = fVar361 * fVar335 + fVar362;
              auVar349._12_4_ = fVar361 * fVar354 + fVar362;
              auVar350 = maxps(auVar349,ZEXT816(0));
              auVar351 = minps(auVar350,auVar344);
LAB_003d26d8:
              auVar346._0_4_ = auVar351._0_4_ * fVar330;
              auVar346._4_4_ = auVar351._4_4_ * fVar343;
              auVar346._8_4_ = auVar351._8_4_ * fVar335;
              auVar346._12_4_ = auVar351._12_4_ * fVar354;
            }
switchD_003d2375_caseD_1:
            *(undefined1 (*) [16])((long)pvVar292 + lVar300 * 0x10) = auVar346;
          }
          pvVar292 = (void *)((long)pvVar292 + (long)(_w * 4) * 4);
        }
        iVar281 = iVar281 + uVar303 * 4;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
LAB_003d272a:
      iVar296 = 0;
      goto LAB_003d27ff;
    }
  }
  iVar306 = (int)((long)iVar282 / (long)iVar53);
  if (opt->use_packing_layout == true) {
    uVar283 = (uint)(((long)iVar296 / (long)iVar53 & 3U) == 0) * 3 + 1;
    uVar295 = (uint)(((long)iVar282 / (long)iVar53 & 3U) == 0) * 3 + 1;
  }
  else {
    uVar283 = 1;
    uVar295 = uVar283;
  }
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_248.data;
  _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(local_248.elemsize._4_4_,(undefined4)local_248.elemsize);
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (int *)0x0) {
    LOCK();
    *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    UNLOCK();
  }
  if ((int)uVar295 < iVar281) {
    opt_p.lightmode = opt->lightmode;
    opt_p._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_p.num_threads = opt->num_threads;
    opt_p.workspace_allocator = opt->workspace_allocator;
    opt_p.openmp_blocktime = opt->openmp_blocktime;
    opt_p.use_winograd_convolution = opt->use_winograd_convolution;
    opt_p.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_p.use_int8_inference = opt->use_int8_inference;
    opt_p.use_vulkan_compute = opt->use_vulkan_compute;
    opt_p.use_bf16_storage = opt->use_bf16_storage;
    opt_p.use_fp16_packed = opt->use_fp16_packed;
    opt_p.use_fp16_storage = opt->use_fp16_storage;
    opt_p.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_p.use_int8_packed = opt->use_int8_packed;
    opt_p.use_int8_storage = opt->use_int8_storage;
    opt_p.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_p.use_packing_layout = opt->use_packing_layout;
    opt_p.use_shader_pack8 = opt->use_shader_pack8;
    opt_p.use_subgroup_basic = opt->use_subgroup_basic;
    opt_p.use_subgroup_vote = opt->use_subgroup_vote;
    opt_p.use_subgroup_ballot = opt->use_subgroup_ballot;
    opt_p.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    opt_p.use_image_storage = opt->use_image_storage;
    opt_p.use_tensor_storage = opt->use_tensor_storage;
    opt_p.use_reserved_0 = opt->use_reserved_0;
    opt_p.flush_denormals = opt->flush_denormals;
    opt_p.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_p.use_shader_local_memory = opt->use_shader_local_memory;
    opt_p.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_p.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_p.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_p.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_p.use_reserved_6 = opt->use_reserved_6;
    opt_p.use_reserved_7 = opt->use_reserved_7;
    opt_p.use_reserved_8 = opt->use_reserved_8;
    opt_p.use_reserved_9 = opt->use_reserved_9;
    opt_p.use_reserved_10 = opt->use_reserved_10;
    opt_p.use_reserved_11 = opt->use_reserved_11;
    opt_p.blob_allocator = opt->workspace_allocator;
    convert_packing(&local_248,(Mat *)&_space_ofs,uVar295,&opt_p);
  }
  iVar281 = (int)((long)iVar296 / (long)iVar53);
  opt_p._0_8_ = top_blob->data;
  opt_p.blob_allocator = (Allocator *)top_blob->refcount;
  opt_p.workspace_allocator = (Allocator *)top_blob->elemsize;
  opt_p.openmp_blocktime = top_blob->elempack;
  opt_p._32_8_ = top_blob->allocator;
  opt_p._40_8_ = *(undefined8 *)&top_blob->dims;
  opt_p._48_8_ = *(undefined8 *)&top_blob->h;
  opt_p._56_4_ = top_blob->c;
  sVar54 = top_blob->cstep;
  if (opt_p.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
    UNLOCK();
  }
  if (uVar283 < uVar303) {
    Mat::create((Mat *)&opt_p,_w,_h,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]) /
                (int)uVar283,(ulong)uVar283 * (uVar314 >> bVar280 * '\x02'),uVar283,
                opt->workspace_allocator);
    iVar296 = -100;
    if ((opt_p._0_8_ != 0) && ((long)(int)opt_p._56_4_ * sVar54 != 0)) goto LAB_003d1534;
  }
  else {
LAB_003d1534:
    iVar296 = 0;
    iVar312 = 0;
    for (lVar300 = 0; uVar51 = opt_p._48_8_, uVar50 = opt_p._40_8_,
        lVar300 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86[-3]);
        lVar300 = lVar300 + 1) {
      m.c = iVar306 / (int)uVar295;
      m.data = (void *)((long)(iVar296 / (int)uVar295) * sVar55 *
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage +
                       (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      m.refcount = (int *)0x0;
      m.elemsize = (size_t)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
      m.elempack = iVar286;
      m.allocator = pAVar276;
      m.w = iVar302;
      m.h = iVar278;
      m.d = iVar279;
      m.cstep = ((long)iVar279 *
                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * (long)iVar278 * (long)iVar302 +
                 0xfU & 0xfffffffffffffff0) /
                (ulong)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      m.dims = iVar52;
      m_1.c = iVar281 / (int)uVar283;
      m_1.data = (void *)((long)(iVar312 / (int)uVar283) * sVar54 * (long)opt_p.workspace_allocator
                         + opt_p._0_8_);
      m_1.refcount = (int *)0x0;
      m_1.elemsize = (size_t)opt_p.workspace_allocator;
      m_1.elempack = opt_p.openmp_blocktime;
      m_1.allocator = (Allocator *)opt_p._32_8_;
      m_1.w._0_1_ = opt_p.use_subgroup_shuffle;
      m_1.w._1_1_ = opt_p.use_image_storage;
      m_1.w._2_1_ = opt_p.use_tensor_storage;
      m_1.w._3_1_ = opt_p.use_reserved_0;
      m_1.h = opt_p.flush_denormals;
      m_1.d._0_1_ = opt_p.use_local_pool_allocator;
      m_1.d._1_1_ = opt_p.use_shader_local_memory;
      m_1.d._2_1_ = opt_p.use_cooperative_matrix;
      m_1.d._3_1_ = opt_p.use_winograd23_convolution;
      m_1.cstep = ((long)(int)opt_p._52_4_ * (long)opt_p.workspace_allocator *
                   (long)opt_p.flush_denormals * (long)(int)opt_p._44_4_ + 0xfU & 0xfffffffffffffff0
                  ) / (ulong)opt_p.workspace_allocator;
      opt_p._40_4_ = SUB84(uVar50,0);
      m_1.dims._0_1_ = opt_p.use_shader_pack8;
      m_1.dims._1_1_ = opt_p.use_subgroup_basic;
      m_1.dims._2_1_ = opt_p.use_subgroup_vote;
      m_1.dims._3_1_ = opt_p.use_subgroup_ballot;
      pLVar301 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar300];
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.openmp_blocktime = opt->openmp_blocktime;
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_packed = opt->use_int8_packed;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_subgroup_basic = opt->use_subgroup_basic;
      opt_g.use_subgroup_vote = opt->use_subgroup_vote;
      opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_g.use_image_storage = opt->use_image_storage;
      opt_g.use_tensor_storage = opt->use_tensor_storage;
      opt_g.use_reserved_0 = opt->use_reserved_0;
      opt_g.flush_denormals = opt->flush_denormals;
      opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_g.use_shader_local_memory = opt->use_shader_local_memory;
      opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
      opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
      opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
      opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
      opt_g.use_reserved_6 = opt->use_reserved_6;
      opt_g.use_reserved_7 = opt->use_reserved_7;
      opt_g.use_reserved_8 = opt->use_reserved_8;
      opt_g.use_reserved_9 = opt->use_reserved_9;
      opt_g.use_reserved_10 = opt->use_reserved_10;
      opt_g.use_reserved_11 = opt->use_reserved_11;
      opt_g.blob_allocator = (Allocator *)opt_p._32_8_;
      opt_p._40_8_ = uVar50;
      opt_p._48_8_ = uVar51;
      (*pLVar301->_vptr_Layer[7])(pLVar301,&m,&m_1,&opt_g);
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            free(m_1.data);
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar312 = iVar312 + iVar281;
      iVar296 = iVar296 + iVar306;
    }
    if (uVar283 < uVar303) {
      convert_packing((Mat *)&opt_p,top_blob,uVar303,opt);
      iVar296 = 0;
    }
    else {
      iVar296 = 0;
      if ((Mat *)&opt_p != top_blob) {
        if (opt_p.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + 1;
          UNLOCK();
        }
        piVar56 = top_blob->refcount;
        if (piVar56 != (int *)0x0) {
          LOCK();
          *piVar56 = *piVar56 + -1;
          UNLOCK();
          if (*piVar56 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar296 = 0;
        top_blob->data = (void *)opt_p._0_8_;
        top_blob->refcount = (int *)opt_p.blob_allocator;
        top_blob->elemsize = (size_t)opt_p.workspace_allocator;
        top_blob->elempack = opt_p.openmp_blocktime;
        top_blob->allocator = (Allocator *)opt_p._32_8_;
        *(undefined8 *)&top_blob->dims = opt_p._40_8_;
        *(undefined8 *)&top_blob->h = opt_p._48_8_;
        top_blob->c = opt_p._56_4_;
        top_blob->cstep = sVar54;
      }
    }
  }
  if (opt_p.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)&(opt_p.blob_allocator)->_vptr_Allocator =
         *(int *)&(opt_p.blob_allocator)->_vptr_Allocator + -1;
    UNLOCK();
    if (*(int *)&(opt_p.blob_allocator)->_vptr_Allocator == 0) {
      if (opt_p._32_8_ == 0) {
        free((void *)opt_p._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_p._32_8_ + 0x18))();
      }
    }
  }
  if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (pointer)0x0) {
    LOCK();
    *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = *_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
    UNLOCK();
    if (*_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish == 0) {
      if (pAVar276 == (Allocator *)0x0) {
        free(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      else {
        (*pAVar276->_vptr_Allocator[3])();
      }
    }
  }
LAB_003d27ff:
  piVar56 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar56 != (int *)0x0) {
    LOCK();
    *piVar56 = *piVar56 + -1;
    UNLOCK();
    if (*piVar56 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        free(local_248.data);
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar296;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack16_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps(((const float*)bias_data) + g * 16);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 16;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m512 _val = _mm512_loadu_ps(sptr + space_ofs[k] * 16);
                                __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                _sum = _mm512_fmadd_ps(_val, _w, _sum);
                            }

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps(((const float*)bias_data) + g * 8);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m256 _val = _mm256_loadu_ps(sptr + space_ofs[k] * 8);
                                __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                            }

                            _mm256_storeu_ps(outptr + j * 8, _sum);
                        }

                        outptr += outw * 8;
                    }
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw5x5s1_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 5 && kernel_h == 5 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw5x5s2_pack4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_set1_ps(0.f);

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps(((const float*)bias_data) + g * 4);
                            }

                            const float* sptr = m.row(i * stride_h) + j * stride_w * 4;

                            for (int k = 0; k < maxk; k++)
                            {
                                __m128 _val = _mm_loadu_ps(sptr + space_ofs[k] * 4);
                                __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr + j * 4, _sum);
                        }

                        outptr += outw * 4;
                    }
                }

                return 0;
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }

                return 0;
            }
        }
    }

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
        g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
        g_elempack = channels_g % 4 == 0 ? 4 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}